

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catmullclark_patch.h
# Opt level: O3

void __thiscall
embree::CatmullClarkPatchT<embree::Vec3fa,_embree::Vec3fa>::subdivide
          (CatmullClarkPatchT<embree::Vec3fa,_embree::Vec3fa> *this,
          array_t<embree::CatmullClarkPatchT<embree::Vec3fa,_embree::Vec3fa>,_4UL> *patch)

{
  DynamicStackArray<float,_16UL,_64UL> *pDVar1;
  DynamicStackArray<embree::Vec3fa,_32UL,_128UL> *pDVar2;
  undefined8 *puVar3;
  long *plVar4;
  undefined8 *puVar5;
  int iVar6;
  Vec3fa *pVVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  size_t i;
  long lVar10;
  Vec3fa *pVVar11;
  Vec3fa *pVVar12;
  long lVar13;
  float *pfVar14;
  ulong uVar15;
  ulong uVar16;
  uint uVar17;
  ulong uVar18;
  long lVar19;
  ulong uVar20;
  uint uVar21;
  ulong uVar22;
  ulong uVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  Vec3fa center_ring [8];
  long local_238 [65];
  
  patch->items[0].ring.items[0].edge_level = (this->ring).items[0].edge_level * 0.5;
  patch->items[0].ring.items[0].vertex_level = (this->ring).items[0].vertex_level * 0.5;
  patch->items[0].ring.items[0].face_valence = (this->ring).items[0].face_valence;
  patch->items[0].ring.items[0].edge_valence = (this->ring).items[0].edge_valence;
  patch->items[0].ring.items[0].border_index = (this->ring).items[0].border_index;
  fVar29 = (this->ring).items[0].vertex_crease_weight + -1.0;
  if (fVar29 <= 0.0) {
    fVar29 = 0.0;
  }
  patch->items[0].ring.items[0].vertex_crease_weight = fVar29;
  patch->items[0].ring.items[0].eval_start_index = (this->ring).items[0].eval_start_index;
  patch->items[0].ring.items[0].eval_unique_identifier =
       (this->ring).items[0].eval_unique_identifier;
  uVar16 = (ulong)(this->ring).items[0].face_valence;
  if (uVar16 == 0) {
    fVar29 = 0.0;
    fVar34 = 0.0;
    fVar35 = 0.0;
    fVar36 = 0.0;
LAB_00d6a589:
    fVar30 = 0.0;
    uVar23 = 0;
  }
  else {
    pDVar2 = &patch->items[0].ring.items[0].ring;
    fVar29 = 0.0;
    fVar34 = 0.0;
    fVar35 = 0.0;
    fVar36 = 0.0;
    uVar20 = 0;
    uVar23 = 0;
    do {
      uVar15 = (ulong)(this->ring).items[0].edge_valence;
      uVar18 = (this->ring).items[0].eval_start_index + uVar23;
      if (uVar18 < uVar16) {
        uVar16 = uVar20;
      }
      lVar19 = uVar18 - uVar16;
      uVar16 = uVar15;
      if ((ulong)(lVar19 * 2) < uVar15) {
        uVar16 = uVar20;
      }
      uVar18 = lVar19 * 2 + 1;
      uVar22 = uVar15;
      if (uVar18 < uVar15) {
        uVar22 = uVar20;
      }
      lVar10 = uVar18 - uVar22;
      uVar18 = lVar19 * 2 + 2;
      if (uVar18 < uVar15) {
        uVar15 = uVar20;
      }
      pVVar7 = (this->ring).items[0].ring.data;
      pVVar12 = pVVar7 + lVar10;
      pVVar11 = pVVar7 + (lVar19 * 2 - uVar16);
      pVVar7 = pVVar7 + (uVar18 - uVar15);
      fVar30 = ((pVVar11->field_0).m128[0] + (pVVar7->field_0).m128[0] +
               (this->ring).items[0].vtx.field_0.m128[0] + (pVVar12->field_0).m128[0]) * 0.25;
      fVar31 = ((pVVar11->field_0).m128[1] + (pVVar7->field_0).m128[1] +
               (this->ring).items[0].vtx.field_0.m128[1] + (pVVar12->field_0).m128[1]) * 0.25;
      fVar32 = ((pVVar11->field_0).m128[2] + (pVVar7->field_0).m128[2] +
               (this->ring).items[0].vtx.field_0.m128[2] + (pVVar12->field_0).m128[2]) * 0.25;
      fVar33 = ((pVVar11->field_0).m128[3] + (pVVar7->field_0).m128[3] +
               (this->ring).items[0].vtx.field_0.m128[3] + (pVVar12->field_0).m128[3]) * 0.25;
      pVVar12 = patch->items[0].ring.items[0].ring.data;
      if ((0x20 < lVar10 + 1U) &&
         ((DynamicStackArray<embree::Vec3fa,_32UL,_128UL> *)pVVar12 == pDVar2)) {
        pVVar12 = (Vec3fa *)alignedMalloc(0x800,0x10);
        patch->items[0].ring.items[0].ring.data = pVVar12;
        lVar19 = 0;
        do {
          puVar5 = (undefined8 *)((long)&patch->items[0].ring.items[0].ring.arr[0].field_0 + lVar19)
          ;
          uVar8 = puVar5[1];
          puVar3 = (undefined8 *)
                   ((long)&(patch->items[0].ring.items[0].ring.data)->field_0 + lVar19);
          *puVar3 = *puVar5;
          puVar3[1] = uVar8;
          lVar19 = lVar19 + 0x10;
        } while (lVar19 != 0x200);
        pVVar12 = patch->items[0].ring.items[0].ring.data;
      }
      pVVar12 = pVVar12 + lVar10;
      (pVVar12->field_0).m128[0] = fVar30;
      (pVVar12->field_0).m128[1] = fVar31;
      (pVVar12->field_0).m128[2] = fVar32;
      (pVVar12->field_0).m128[3] = fVar33;
      fVar29 = fVar29 + fVar30;
      fVar34 = fVar34 + fVar31;
      fVar35 = fVar35 + fVar32;
      fVar36 = fVar36 + fVar33;
      uVar23 = uVar23 + 1;
      uVar16 = (ulong)(this->ring).items[0].face_valence;
    } while (uVar23 < uVar16);
    if (uVar16 == 0) goto LAB_00d6a589;
    uVar23 = 0;
    uVar20 = 0;
    do {
      uVar18 = (this->ring).items[0].eval_start_index + uVar20;
      uVar15 = 0;
      if (uVar16 <= uVar18) {
        uVar15 = uVar16;
      }
      lVar19 = uVar18 - uVar15;
      fVar30 = (this->ring).items[0].crease_weight.data[lVar19];
      pfVar14 = patch->items[0].ring.items[0].crease_weight.data;
      if ((0x10 < lVar19 + 1U) &&
         ((DynamicStackArray<float,_16UL,_64UL> *)pfVar14 ==
          &patch->items[0].ring.items[0].crease_weight)) {
        pfVar14 = (float *)operator_new__(0x100);
        patch->items[0].ring.items[0].crease_weight.data = pfVar14;
        lVar10 = 0;
        do {
          patch->items[0].ring.items[0].crease_weight.data[lVar10] =
               patch->items[0].ring.items[0].crease_weight.arr[lVar10];
          lVar10 = lVar10 + 1;
        } while (lVar10 != 0x10);
        pfVar14 = patch->items[0].ring.items[0].crease_weight.data;
      }
      fVar31 = 0.0;
      if (0.0 <= fVar30 + -1.0) {
        fVar31 = fVar30 + -1.0;
      }
      pfVar14[lVar19] = fVar31;
      uVar16 = lVar19 * 2 - 1;
      if (uVar18 == uVar15) {
        uVar16 = (ulong)((this->ring).items[0].edge_valence - 1);
      }
      pVVar12 = (this->ring).items[0].ring.data + lVar19 * 2;
      fVar31 = (this->ring).items[0].vtx.field_0.m128[0] + (pVVar12->field_0).m128[0];
      fVar32 = (this->ring).items[0].vtx.field_0.m128[1] + (pVVar12->field_0).m128[1];
      fVar33 = (this->ring).items[0].vtx.field_0.m128[2] + (pVVar12->field_0).m128[2];
      fVar37 = (this->ring).items[0].vtx.field_0.m128[3] + (pVVar12->field_0).m128[3];
      pVVar12 = patch->items[0].ring.items[0].ring.data;
      if ((0x20 < uVar16 + 1) &&
         ((DynamicStackArray<embree::Vec3fa,_32UL,_128UL> *)pVVar12 == pDVar2)) {
        pVVar12 = (Vec3fa *)alignedMalloc(0x800,0x10);
        patch->items[0].ring.items[0].ring.data = pVVar12;
        lVar10 = 0;
        do {
          puVar5 = (undefined8 *)((long)&patch->items[0].ring.items[0].ring.arr[0].field_0 + lVar10)
          ;
          uVar8 = puVar5[1];
          puVar3 = (undefined8 *)
                   ((long)&(patch->items[0].ring.items[0].ring.data)->field_0 + lVar10);
          *puVar3 = *puVar5;
          puVar3[1] = uVar8;
          lVar10 = lVar10 + 0x10;
        } while (lVar10 != 0x200);
        pVVar12 = patch->items[0].ring.items[0].ring.data;
      }
      pVVar11 = pVVar12;
      if ((0x20 < lVar19 * 2 + 2U) &&
         ((DynamicStackArray<embree::Vec3fa,_32UL,_128UL> *)pVVar12 == pDVar2)) {
        pVVar11 = (Vec3fa *)alignedMalloc(0x800,0x10);
        patch->items[0].ring.items[0].ring.data = pVVar11;
        lVar10 = 0;
        do {
          puVar5 = (undefined8 *)((long)&patch->items[0].ring.items[0].ring.arr[0].field_0 + lVar10)
          ;
          uVar8 = puVar5[1];
          puVar3 = (undefined8 *)
                   ((long)&(patch->items[0].ring.items[0].ring.data)->field_0 + lVar10);
          *puVar3 = *puVar5;
          puVar3[1] = uVar8;
          lVar10 = lVar10 + 0x10;
        } while (lVar10 != 0x200);
        pVVar11 = patch->items[0].ring.items[0].ring.data;
      }
      uVar15 = lVar19 * 2 + 1;
      pVVar12 = pVVar12 + uVar16;
      pVVar7 = pVVar11 + uVar15;
      fVar24 = (pVVar12->field_0).m128[0] + (pVVar7->field_0).m128[0];
      fVar26 = (pVVar12->field_0).m128[1] + (pVVar7->field_0).m128[1];
      fVar27 = (pVVar12->field_0).m128[2] + (pVVar7->field_0).m128[2];
      fVar28 = (pVVar12->field_0).m128[3] + (pVVar7->field_0).m128[3];
      pVVar12 = (this->ring).items[0].ring.data + lVar19 * 2;
      fVar29 = fVar29 + (pVVar12->field_0).m128[0];
      fVar34 = fVar34 + (pVVar12->field_0).m128[1];
      fVar35 = fVar35 + (pVVar12->field_0).m128[2];
      fVar36 = fVar36 + (pVVar12->field_0).m128[3];
      if (0.0 < fVar30) {
        local_238[uVar23] = lVar19;
        if ((0x20 < uVar15) && ((DynamicStackArray<embree::Vec3fa,_32UL,_128UL> *)pVVar11 == pDVar2)
           ) {
          pVVar12 = (Vec3fa *)alignedMalloc(0x800,0x10);
          patch->items[0].ring.items[0].ring.data = pVVar12;
          lVar10 = 0;
          do {
            puVar5 = (undefined8 *)
                     ((long)&patch->items[0].ring.items[0].ring.arr[0].field_0 + lVar10);
            uVar8 = puVar5[1];
            puVar3 = (undefined8 *)
                     ((long)&(patch->items[0].ring.items[0].ring.data)->field_0 + lVar10);
            *puVar3 = *puVar5;
            puVar3[1] = uVar8;
            lVar10 = lVar10 + 0x10;
          } while (lVar10 != 0x200);
          pVVar11 = patch->items[0].ring.items[0].ring.data;
        }
        uVar23 = uVar23 + 1;
        pVVar11 = pVVar11 + lVar19 * 2;
        (pVVar11->field_0).m128[0] = fVar31 * 0.5;
        (pVVar11->field_0).m128[1] = fVar32 * 0.5;
        (pVVar11->field_0).m128[2] = fVar33 * 0.5;
        (pVVar11->field_0).m128[3] = fVar37 * 0.5;
        if (fVar30 < 1.0) {
          fVar25 = 1.0 - fVar30;
          fVar31 = (fVar31 + fVar24) * 0.25 * fVar25 + fVar30 * fVar31 * 0.5;
          fVar32 = (fVar32 + fVar26) * 0.25 * fVar25 + fVar30 * fVar32 * 0.5;
          fVar33 = (fVar33 + fVar27) * 0.25 * fVar25 + fVar30 * fVar33 * 0.5;
          fVar30 = (fVar37 + fVar28) * 0.25 * fVar25 + fVar30 * fVar37 * 0.5;
          pVVar11 = patch->items[0].ring.items[0].ring.data;
          if ((0x20 < uVar15) &&
             ((DynamicStackArray<embree::Vec3fa,_32UL,_128UL> *)pVVar11 == pDVar2)) {
            pVVar12 = (Vec3fa *)alignedMalloc(0x800,0x10);
            patch->items[0].ring.items[0].ring.data = pVVar12;
            lVar10 = 0;
            do {
              puVar5 = (undefined8 *)
                       ((long)&patch->items[0].ring.items[0].ring.arr[0].field_0 + lVar10);
              uVar8 = puVar5[1];
              puVar3 = (undefined8 *)
                       ((long)&(patch->items[0].ring.items[0].ring.data)->field_0 + lVar10);
              *puVar3 = *puVar5;
              puVar3[1] = uVar8;
              lVar10 = lVar10 + 0x10;
            } while (lVar10 != 0x200);
            pVVar11 = patch->items[0].ring.items[0].ring.data;
          }
          goto LAB_00d6a0ad;
        }
      }
      else {
        fVar31 = (fVar31 + fVar24) * 0.25;
        fVar32 = (fVar32 + fVar26) * 0.25;
        fVar33 = (fVar33 + fVar27) * 0.25;
        fVar30 = (fVar37 + fVar28) * 0.25;
        if ((0x20 < uVar15) && ((DynamicStackArray<embree::Vec3fa,_32UL,_128UL> *)pVVar11 == pDVar2)
           ) {
          pVVar12 = (Vec3fa *)alignedMalloc(0x800,0x10);
          patch->items[0].ring.items[0].ring.data = pVVar12;
          lVar10 = 0;
          do {
            puVar5 = (undefined8 *)
                     ((long)&patch->items[0].ring.items[0].ring.arr[0].field_0 + lVar10);
            uVar8 = puVar5[1];
            puVar3 = (undefined8 *)
                     ((long)&(patch->items[0].ring.items[0].ring.data)->field_0 + lVar10);
            *puVar3 = *puVar5;
            puVar3[1] = uVar8;
            lVar10 = lVar10 + 0x10;
          } while (lVar10 != 0x200);
          pVVar11 = patch->items[0].ring.items[0].ring.data;
        }
LAB_00d6a0ad:
        pVVar11 = pVVar11 + lVar19 * 2;
        (pVVar11->field_0).m128[0] = fVar31;
        (pVVar11->field_0).m128[1] = fVar32;
        (pVVar11->field_0).m128[2] = fVar33;
        (pVVar11->field_0).m128[3] = fVar30;
      }
      uVar20 = uVar20 + 1;
      uVar16 = (ulong)(this->ring).items[0].face_valence;
    } while (uVar20 < uVar16);
    fVar30 = (float)uVar16;
  }
  lVar10 = local_238[1];
  lVar19 = local_238[0];
  fVar31 = 1.0 / fVar30;
  fVar30 = fVar30 + -2.0;
  fVar32 = (fVar29 * fVar31 + fVar30 * (this->ring).items[0].vtx.field_0.m128[0]) * fVar31;
  fVar34 = (fVar34 * fVar31 + fVar30 * (this->ring).items[0].vtx.field_0.m128[1]) * fVar31;
  fVar35 = (fVar35 * fVar31 + fVar30 * (this->ring).items[0].vtx.field_0.m128[2]) * fVar31;
  fVar31 = (fVar36 * fVar31 + fVar30 * (this->ring).items[0].vtx.field_0.m128[3]) * fVar31;
  patch->items[0].ring.items[0].vtx.field_0.m128[0] = fVar32;
  patch->items[0].ring.items[0].vtx.field_0.m128[1] = fVar34;
  patch->items[0].ring.items[0].vtx.field_0.m128[2] = fVar35;
  patch->items[0].ring.items[0].vtx.field_0.m128[3] = fVar31;
  fVar29 = (this->ring).items[0].vertex_crease_weight;
  if (0.0 < fVar29) {
    if (1.0 <= fVar29) {
LAB_00d6d8fd:
      fVar36 = (this->ring).items[0].vtx.field_0.m128[0];
      fVar34 = (this->ring).items[0].vtx.field_0.m128[1];
      fVar35 = (this->ring).items[0].vtx.field_0.m128[2];
      fVar29 = (this->ring).items[0].vtx.field_0.m128[3];
    }
    else {
      fVar30 = 1.0 - fVar29;
      fVar36 = fVar32 * fVar30 + fVar29 * (this->ring).items[0].vtx.field_0.m128[0];
      fVar34 = fVar34 * fVar30 + fVar29 * (this->ring).items[0].vtx.field_0.m128[1];
      fVar35 = fVar35 * fVar30 + fVar29 * (this->ring).items[0].vtx.field_0.m128[2];
      fVar29 = fVar31 * fVar30 + fVar29 * (this->ring).items[0].vtx.field_0.m128[3];
    }
LAB_00d6d905:
    patch->items[0].ring.items[0].vtx.field_0.m128[0] = fVar36;
    patch->items[0].ring.items[0].vtx.field_0.m128[1] = fVar34;
    patch->items[0].ring.items[0].vtx.field_0.m128[2] = fVar35;
    patch->items[0].ring.items[0].vtx.field_0.m128[3] = fVar29;
  }
  else if (1 < uVar23) {
    if (uVar23 != 2) goto LAB_00d6d8fd;
    pVVar11 = (this->ring).items[0].ring.data;
    pVVar12 = pVVar11 + local_238[0] * 2;
    pVVar11 = pVVar11 + local_238[1] * 2;
    fVar37 = ((this->ring).items[0].vtx.field_0.m128[0] * 6.0 + (pVVar12->field_0).m128[0] +
             (pVVar11->field_0).m128[0]) * 0.125;
    fVar24 = ((this->ring).items[0].vtx.field_0.m128[1] * 6.0 + (pVVar12->field_0).m128[1] +
             (pVVar11->field_0).m128[1]) * 0.125;
    fVar26 = ((this->ring).items[0].vtx.field_0.m128[2] * 6.0 + (pVVar12->field_0).m128[2] +
             (pVVar11->field_0).m128[2]) * 0.125;
    fVar27 = ((this->ring).items[0].vtx.field_0.m128[3] * 6.0 + (pVVar12->field_0).m128[3] +
             (pVVar11->field_0).m128[3]) * 0.125;
    patch->items[0].ring.items[0].vtx.field_0.m128[0] = fVar37;
    patch->items[0].ring.items[0].vtx.field_0.m128[1] = fVar24;
    patch->items[0].ring.items[0].vtx.field_0.m128[2] = fVar26;
    patch->items[0].ring.items[0].vtx.field_0.m128[3] = fVar27;
    pfVar14 = (this->ring).items[0].crease_weight.data;
    fVar29 = pfVar14[local_238[0]];
    fVar36 = pfVar14[local_238[1]];
    fVar33 = (fVar29 * 3.0 + fVar36) * 0.25 + -1.0;
    fVar30 = 0.0;
    if (0.0 <= fVar33) {
      fVar30 = fVar33;
    }
    pDVar1 = &patch->items[0].ring.items[0].crease_weight;
    if ((0x10 < local_238[0] + 1U) &&
       ((DynamicStackArray<float,_16UL,_64UL> *)patch->items[0].ring.items[0].crease_weight.data ==
        pDVar1)) {
      pfVar14 = (float *)operator_new__(0x100);
      patch->items[0].ring.items[0].crease_weight.data = pfVar14;
      lVar13 = 0;
      do {
        patch->items[0].ring.items[0].crease_weight.data[lVar13] =
             patch->items[0].ring.items[0].crease_weight.arr[lVar13];
        lVar13 = lVar13 + 1;
      } while (lVar13 != 0x10);
    }
    patch->items[0].ring.items[0].crease_weight.data[lVar19] = fVar30;
    fVar33 = (fVar36 * 3.0 + fVar29) * 0.25 + -1.0;
    fVar30 = 0.0;
    if (0.0 <= fVar33) {
      fVar30 = fVar33;
    }
    pfVar14 = patch->items[0].ring.items[0].crease_weight.data;
    if ((0x10 < lVar10 + 1U) && ((DynamicStackArray<float,_16UL,_64UL> *)pfVar14 == pDVar1)) {
      pfVar14 = (float *)operator_new__(0x100);
      patch->items[0].ring.items[0].crease_weight.data = pfVar14;
      lVar19 = 0;
      do {
        patch->items[0].ring.items[0].crease_weight.data[lVar19] =
             patch->items[0].ring.items[0].crease_weight.arr[lVar19];
        lVar19 = lVar19 + 1;
      } while (lVar19 != 0x10);
      pfVar14 = patch->items[0].ring.items[0].crease_weight.data;
    }
    pfVar14[lVar10] = fVar30;
    fVar29 = (fVar29 + fVar36) * 0.5;
    if (fVar29 < 1.0) {
      fVar30 = 1.0 - fVar29;
      fVar36 = fVar32 * fVar30 + fVar37 * fVar29;
      fVar34 = fVar34 * fVar30 + fVar24 * fVar29;
      fVar35 = fVar35 * fVar30 + fVar26 * fVar29;
      fVar29 = fVar31 * fVar30 + fVar27 * fVar29;
      goto LAB_00d6d905;
    }
  }
  patch->items[1].ring.items[1].edge_level = (this->ring).items[1].edge_level * 0.5;
  patch->items[1].ring.items[1].vertex_level = (this->ring).items[1].vertex_level * 0.5;
  patch->items[1].ring.items[1].face_valence = (this->ring).items[1].face_valence;
  patch->items[1].ring.items[1].edge_valence = (this->ring).items[1].edge_valence;
  patch->items[1].ring.items[1].border_index = (this->ring).items[1].border_index;
  fVar29 = (this->ring).items[1].vertex_crease_weight + -1.0;
  if (fVar29 <= 0.0) {
    fVar29 = 0.0;
  }
  patch->items[1].ring.items[1].vertex_crease_weight = fVar29;
  patch->items[1].ring.items[1].eval_start_index = (this->ring).items[1].eval_start_index;
  patch->items[1].ring.items[1].eval_unique_identifier =
       (this->ring).items[1].eval_unique_identifier;
  uVar16 = (ulong)(this->ring).items[1].face_valence;
  if (uVar16 == 0) {
    fVar29 = 0.0;
    fVar34 = 0.0;
    fVar35 = 0.0;
    fVar36 = 0.0;
LAB_00d6adda:
    fVar30 = 0.0;
    uVar23 = 0;
  }
  else {
    pDVar2 = &patch->items[1].ring.items[1].ring;
    fVar29 = 0.0;
    fVar34 = 0.0;
    fVar35 = 0.0;
    fVar36 = 0.0;
    uVar20 = 0;
    uVar23 = 0;
    do {
      uVar15 = (ulong)(this->ring).items[1].edge_valence;
      uVar18 = (this->ring).items[1].eval_start_index + uVar23;
      if (uVar18 < uVar16) {
        uVar16 = uVar20;
      }
      lVar19 = uVar18 - uVar16;
      uVar16 = uVar15;
      if ((ulong)(lVar19 * 2) < uVar15) {
        uVar16 = uVar20;
      }
      uVar18 = lVar19 * 2 + 1;
      uVar22 = uVar15;
      if (uVar18 < uVar15) {
        uVar22 = uVar20;
      }
      lVar10 = uVar18 - uVar22;
      uVar18 = lVar19 * 2 + 2;
      if (uVar18 < uVar15) {
        uVar15 = uVar20;
      }
      pVVar7 = (this->ring).items[1].ring.data;
      pVVar12 = pVVar7 + lVar10;
      pVVar11 = pVVar7 + (lVar19 * 2 - uVar16);
      pVVar7 = pVVar7 + (uVar18 - uVar15);
      fVar30 = ((pVVar11->field_0).m128[0] + (pVVar7->field_0).m128[0] +
               (this->ring).items[1].vtx.field_0.m128[0] + (pVVar12->field_0).m128[0]) * 0.25;
      fVar31 = ((pVVar11->field_0).m128[1] + (pVVar7->field_0).m128[1] +
               (this->ring).items[1].vtx.field_0.m128[1] + (pVVar12->field_0).m128[1]) * 0.25;
      fVar32 = ((pVVar11->field_0).m128[2] + (pVVar7->field_0).m128[2] +
               (this->ring).items[1].vtx.field_0.m128[2] + (pVVar12->field_0).m128[2]) * 0.25;
      fVar33 = ((pVVar11->field_0).m128[3] + (pVVar7->field_0).m128[3] +
               (this->ring).items[1].vtx.field_0.m128[3] + (pVVar12->field_0).m128[3]) * 0.25;
      pVVar12 = patch->items[1].ring.items[1].ring.data;
      if ((0x20 < lVar10 + 1U) &&
         ((DynamicStackArray<embree::Vec3fa,_32UL,_128UL> *)pVVar12 == pDVar2)) {
        pVVar12 = (Vec3fa *)alignedMalloc(0x800,0x10);
        patch->items[1].ring.items[1].ring.data = pVVar12;
        lVar19 = 0;
        do {
          puVar5 = (undefined8 *)((long)&patch->items[1].ring.items[1].ring.arr[0].field_0 + lVar19)
          ;
          uVar8 = puVar5[1];
          puVar3 = (undefined8 *)
                   ((long)&(patch->items[1].ring.items[1].ring.data)->field_0 + lVar19);
          *puVar3 = *puVar5;
          puVar3[1] = uVar8;
          lVar19 = lVar19 + 0x10;
        } while (lVar19 != 0x200);
        pVVar12 = patch->items[1].ring.items[1].ring.data;
      }
      pVVar12 = pVVar12 + lVar10;
      (pVVar12->field_0).m128[0] = fVar30;
      (pVVar12->field_0).m128[1] = fVar31;
      (pVVar12->field_0).m128[2] = fVar32;
      (pVVar12->field_0).m128[3] = fVar33;
      fVar29 = fVar29 + fVar30;
      fVar34 = fVar34 + fVar31;
      fVar35 = fVar35 + fVar32;
      fVar36 = fVar36 + fVar33;
      uVar23 = uVar23 + 1;
      uVar16 = (ulong)(this->ring).items[1].face_valence;
    } while (uVar23 < uVar16);
    if (uVar16 == 0) goto LAB_00d6adda;
    uVar23 = 0;
    uVar20 = 0;
    do {
      uVar18 = (this->ring).items[1].eval_start_index + uVar20;
      uVar15 = 0;
      if (uVar16 <= uVar18) {
        uVar15 = uVar16;
      }
      lVar19 = uVar18 - uVar15;
      fVar30 = (this->ring).items[1].crease_weight.data[lVar19];
      pfVar14 = patch->items[1].ring.items[1].crease_weight.data;
      if ((0x10 < lVar19 + 1U) &&
         ((DynamicStackArray<float,_16UL,_64UL> *)pfVar14 ==
          &patch->items[1].ring.items[1].crease_weight)) {
        pfVar14 = (float *)operator_new__(0x100);
        patch->items[1].ring.items[1].crease_weight.data = pfVar14;
        lVar10 = 0;
        do {
          patch->items[1].ring.items[1].crease_weight.data[lVar10] =
               patch->items[1].ring.items[1].crease_weight.arr[lVar10];
          lVar10 = lVar10 + 1;
        } while (lVar10 != 0x10);
        pfVar14 = patch->items[1].ring.items[1].crease_weight.data;
      }
      fVar31 = 0.0;
      if (0.0 <= fVar30 + -1.0) {
        fVar31 = fVar30 + -1.0;
      }
      pfVar14[lVar19] = fVar31;
      uVar16 = lVar19 * 2 - 1;
      if (uVar18 == uVar15) {
        uVar16 = (ulong)((this->ring).items[1].edge_valence - 1);
      }
      pVVar12 = (this->ring).items[1].ring.data + lVar19 * 2;
      fVar31 = (this->ring).items[1].vtx.field_0.m128[0] + (pVVar12->field_0).m128[0];
      fVar32 = (this->ring).items[1].vtx.field_0.m128[1] + (pVVar12->field_0).m128[1];
      fVar33 = (this->ring).items[1].vtx.field_0.m128[2] + (pVVar12->field_0).m128[2];
      fVar37 = (this->ring).items[1].vtx.field_0.m128[3] + (pVVar12->field_0).m128[3];
      pVVar12 = patch->items[1].ring.items[1].ring.data;
      if ((0x20 < uVar16 + 1) &&
         ((DynamicStackArray<embree::Vec3fa,_32UL,_128UL> *)pVVar12 == pDVar2)) {
        pVVar12 = (Vec3fa *)alignedMalloc(0x800,0x10);
        patch->items[1].ring.items[1].ring.data = pVVar12;
        lVar10 = 0;
        do {
          puVar5 = (undefined8 *)((long)&patch->items[1].ring.items[1].ring.arr[0].field_0 + lVar10)
          ;
          uVar8 = puVar5[1];
          puVar3 = (undefined8 *)
                   ((long)&(patch->items[1].ring.items[1].ring.data)->field_0 + lVar10);
          *puVar3 = *puVar5;
          puVar3[1] = uVar8;
          lVar10 = lVar10 + 0x10;
        } while (lVar10 != 0x200);
        pVVar12 = patch->items[1].ring.items[1].ring.data;
      }
      pVVar11 = pVVar12;
      if ((0x20 < lVar19 * 2 + 2U) &&
         ((DynamicStackArray<embree::Vec3fa,_32UL,_128UL> *)pVVar12 == pDVar2)) {
        pVVar11 = (Vec3fa *)alignedMalloc(0x800,0x10);
        patch->items[1].ring.items[1].ring.data = pVVar11;
        lVar10 = 0;
        do {
          puVar5 = (undefined8 *)((long)&patch->items[1].ring.items[1].ring.arr[0].field_0 + lVar10)
          ;
          uVar8 = puVar5[1];
          puVar3 = (undefined8 *)
                   ((long)&(patch->items[1].ring.items[1].ring.data)->field_0 + lVar10);
          *puVar3 = *puVar5;
          puVar3[1] = uVar8;
          lVar10 = lVar10 + 0x10;
        } while (lVar10 != 0x200);
        pVVar11 = patch->items[1].ring.items[1].ring.data;
      }
      uVar15 = lVar19 * 2 + 1;
      pVVar12 = pVVar12 + uVar16;
      pVVar7 = pVVar11 + uVar15;
      fVar24 = (pVVar12->field_0).m128[0] + (pVVar7->field_0).m128[0];
      fVar26 = (pVVar12->field_0).m128[1] + (pVVar7->field_0).m128[1];
      fVar27 = (pVVar12->field_0).m128[2] + (pVVar7->field_0).m128[2];
      fVar28 = (pVVar12->field_0).m128[3] + (pVVar7->field_0).m128[3];
      pVVar12 = (this->ring).items[1].ring.data + lVar19 * 2;
      fVar29 = fVar29 + (pVVar12->field_0).m128[0];
      fVar34 = fVar34 + (pVVar12->field_0).m128[1];
      fVar35 = fVar35 + (pVVar12->field_0).m128[2];
      fVar36 = fVar36 + (pVVar12->field_0).m128[3];
      if (0.0 < fVar30) {
        local_238[uVar23] = lVar19;
        if ((0x20 < uVar15) && ((DynamicStackArray<embree::Vec3fa,_32UL,_128UL> *)pVVar11 == pDVar2)
           ) {
          pVVar12 = (Vec3fa *)alignedMalloc(0x800,0x10);
          patch->items[1].ring.items[1].ring.data = pVVar12;
          lVar10 = 0;
          do {
            puVar5 = (undefined8 *)
                     ((long)&patch->items[1].ring.items[1].ring.arr[0].field_0 + lVar10);
            uVar8 = puVar5[1];
            puVar3 = (undefined8 *)
                     ((long)&(patch->items[1].ring.items[1].ring.data)->field_0 + lVar10);
            *puVar3 = *puVar5;
            puVar3[1] = uVar8;
            lVar10 = lVar10 + 0x10;
          } while (lVar10 != 0x200);
          pVVar11 = patch->items[1].ring.items[1].ring.data;
        }
        uVar23 = uVar23 + 1;
        pVVar11 = pVVar11 + lVar19 * 2;
        (pVVar11->field_0).m128[0] = fVar31 * 0.5;
        (pVVar11->field_0).m128[1] = fVar32 * 0.5;
        (pVVar11->field_0).m128[2] = fVar33 * 0.5;
        (pVVar11->field_0).m128[3] = fVar37 * 0.5;
        if (fVar30 < 1.0) {
          fVar25 = 1.0 - fVar30;
          fVar31 = (fVar31 + fVar24) * 0.25 * fVar25 + fVar30 * fVar31 * 0.5;
          fVar32 = (fVar32 + fVar26) * 0.25 * fVar25 + fVar30 * fVar32 * 0.5;
          fVar33 = (fVar33 + fVar27) * 0.25 * fVar25 + fVar30 * fVar33 * 0.5;
          fVar30 = (fVar37 + fVar28) * 0.25 * fVar25 + fVar30 * fVar37 * 0.5;
          pVVar11 = patch->items[1].ring.items[1].ring.data;
          if ((0x20 < uVar15) &&
             ((DynamicStackArray<embree::Vec3fa,_32UL,_128UL> *)pVVar11 == pDVar2)) {
            pVVar12 = (Vec3fa *)alignedMalloc(0x800,0x10);
            patch->items[1].ring.items[1].ring.data = pVVar12;
            lVar10 = 0;
            do {
              puVar5 = (undefined8 *)
                       ((long)&patch->items[1].ring.items[1].ring.arr[0].field_0 + lVar10);
              uVar8 = puVar5[1];
              puVar3 = (undefined8 *)
                       ((long)&(patch->items[1].ring.items[1].ring.data)->field_0 + lVar10);
              *puVar3 = *puVar5;
              puVar3[1] = uVar8;
              lVar10 = lVar10 + 0x10;
            } while (lVar10 != 0x200);
            pVVar11 = patch->items[1].ring.items[1].ring.data;
          }
          goto LAB_00d6a8f0;
        }
      }
      else {
        fVar31 = (fVar31 + fVar24) * 0.25;
        fVar32 = (fVar32 + fVar26) * 0.25;
        fVar33 = (fVar33 + fVar27) * 0.25;
        fVar30 = (fVar37 + fVar28) * 0.25;
        if ((0x20 < uVar15) && ((DynamicStackArray<embree::Vec3fa,_32UL,_128UL> *)pVVar11 == pDVar2)
           ) {
          pVVar12 = (Vec3fa *)alignedMalloc(0x800,0x10);
          patch->items[1].ring.items[1].ring.data = pVVar12;
          lVar10 = 0;
          do {
            puVar5 = (undefined8 *)
                     ((long)&patch->items[1].ring.items[1].ring.arr[0].field_0 + lVar10);
            uVar8 = puVar5[1];
            puVar3 = (undefined8 *)
                     ((long)&(patch->items[1].ring.items[1].ring.data)->field_0 + lVar10);
            *puVar3 = *puVar5;
            puVar3[1] = uVar8;
            lVar10 = lVar10 + 0x10;
          } while (lVar10 != 0x200);
          pVVar11 = patch->items[1].ring.items[1].ring.data;
        }
LAB_00d6a8f0:
        pVVar11 = pVVar11 + lVar19 * 2;
        (pVVar11->field_0).m128[0] = fVar31;
        (pVVar11->field_0).m128[1] = fVar32;
        (pVVar11->field_0).m128[2] = fVar33;
        (pVVar11->field_0).m128[3] = fVar30;
      }
      uVar20 = uVar20 + 1;
      uVar16 = (ulong)(this->ring).items[1].face_valence;
    } while (uVar20 < uVar16);
    fVar30 = (float)uVar16;
  }
  lVar10 = local_238[1];
  lVar19 = local_238[0];
  fVar31 = 1.0 / fVar30;
  fVar30 = fVar30 + -2.0;
  fVar32 = (fVar29 * fVar31 + fVar30 * (this->ring).items[1].vtx.field_0.m128[0]) * fVar31;
  fVar34 = (fVar34 * fVar31 + fVar30 * (this->ring).items[1].vtx.field_0.m128[1]) * fVar31;
  fVar35 = (fVar35 * fVar31 + fVar30 * (this->ring).items[1].vtx.field_0.m128[2]) * fVar31;
  fVar31 = (fVar36 * fVar31 + fVar30 * (this->ring).items[1].vtx.field_0.m128[3]) * fVar31;
  patch->items[1].ring.items[1].vtx.field_0.m128[0] = fVar32;
  patch->items[1].ring.items[1].vtx.field_0.m128[1] = fVar34;
  patch->items[1].ring.items[1].vtx.field_0.m128[2] = fVar35;
  patch->items[1].ring.items[1].vtx.field_0.m128[3] = fVar31;
  fVar29 = (this->ring).items[1].vertex_crease_weight;
  if (0.0 < fVar29) {
    if (1.0 <= fVar29) {
LAB_00d6d912:
      fVar36 = (this->ring).items[1].vtx.field_0.m128[0];
      fVar34 = (this->ring).items[1].vtx.field_0.m128[1];
      fVar35 = (this->ring).items[1].vtx.field_0.m128[2];
      fVar29 = (this->ring).items[1].vtx.field_0.m128[3];
    }
    else {
      fVar30 = 1.0 - fVar29;
      fVar36 = fVar32 * fVar30 + fVar29 * (this->ring).items[1].vtx.field_0.m128[0];
      fVar34 = fVar34 * fVar30 + fVar29 * (this->ring).items[1].vtx.field_0.m128[1];
      fVar35 = fVar35 * fVar30 + fVar29 * (this->ring).items[1].vtx.field_0.m128[2];
      fVar29 = fVar31 * fVar30 + fVar29 * (this->ring).items[1].vtx.field_0.m128[3];
    }
LAB_00d6d91a:
    patch->items[1].ring.items[1].vtx.field_0.m128[0] = fVar36;
    patch->items[1].ring.items[1].vtx.field_0.m128[1] = fVar34;
    patch->items[1].ring.items[1].vtx.field_0.m128[2] = fVar35;
    patch->items[1].ring.items[1].vtx.field_0.m128[3] = fVar29;
  }
  else if (1 < uVar23) {
    if (uVar23 != 2) goto LAB_00d6d912;
    pVVar11 = (this->ring).items[1].ring.data;
    pVVar12 = pVVar11 + local_238[0] * 2;
    pVVar11 = pVVar11 + local_238[1] * 2;
    fVar37 = ((this->ring).items[1].vtx.field_0.m128[0] * 6.0 + (pVVar12->field_0).m128[0] +
             (pVVar11->field_0).m128[0]) * 0.125;
    fVar24 = ((this->ring).items[1].vtx.field_0.m128[1] * 6.0 + (pVVar12->field_0).m128[1] +
             (pVVar11->field_0).m128[1]) * 0.125;
    fVar26 = ((this->ring).items[1].vtx.field_0.m128[2] * 6.0 + (pVVar12->field_0).m128[2] +
             (pVVar11->field_0).m128[2]) * 0.125;
    fVar27 = ((this->ring).items[1].vtx.field_0.m128[3] * 6.0 + (pVVar12->field_0).m128[3] +
             (pVVar11->field_0).m128[3]) * 0.125;
    patch->items[1].ring.items[1].vtx.field_0.m128[0] = fVar37;
    patch->items[1].ring.items[1].vtx.field_0.m128[1] = fVar24;
    patch->items[1].ring.items[1].vtx.field_0.m128[2] = fVar26;
    patch->items[1].ring.items[1].vtx.field_0.m128[3] = fVar27;
    pfVar14 = (this->ring).items[1].crease_weight.data;
    fVar29 = pfVar14[local_238[0]];
    fVar36 = pfVar14[local_238[1]];
    fVar33 = (fVar29 * 3.0 + fVar36) * 0.25 + -1.0;
    fVar30 = 0.0;
    if (0.0 <= fVar33) {
      fVar30 = fVar33;
    }
    pDVar1 = &patch->items[1].ring.items[1].crease_weight;
    if ((0x10 < local_238[0] + 1U) &&
       ((DynamicStackArray<float,_16UL,_64UL> *)patch->items[1].ring.items[1].crease_weight.data ==
        pDVar1)) {
      pfVar14 = (float *)operator_new__(0x100);
      patch->items[1].ring.items[1].crease_weight.data = pfVar14;
      lVar13 = 0;
      do {
        patch->items[1].ring.items[1].crease_weight.data[lVar13] =
             patch->items[1].ring.items[1].crease_weight.arr[lVar13];
        lVar13 = lVar13 + 1;
      } while (lVar13 != 0x10);
    }
    patch->items[1].ring.items[1].crease_weight.data[lVar19] = fVar30;
    fVar33 = (fVar36 * 3.0 + fVar29) * 0.25 + -1.0;
    fVar30 = 0.0;
    if (0.0 <= fVar33) {
      fVar30 = fVar33;
    }
    pfVar14 = patch->items[1].ring.items[1].crease_weight.data;
    if ((0x10 < lVar10 + 1U) && ((DynamicStackArray<float,_16UL,_64UL> *)pfVar14 == pDVar1)) {
      pfVar14 = (float *)operator_new__(0x100);
      patch->items[1].ring.items[1].crease_weight.data = pfVar14;
      lVar19 = 0;
      do {
        patch->items[1].ring.items[1].crease_weight.data[lVar19] =
             patch->items[1].ring.items[1].crease_weight.arr[lVar19];
        lVar19 = lVar19 + 1;
      } while (lVar19 != 0x10);
      pfVar14 = patch->items[1].ring.items[1].crease_weight.data;
    }
    pfVar14[lVar10] = fVar30;
    fVar29 = (fVar29 + fVar36) * 0.5;
    if (fVar29 < 1.0) {
      fVar30 = 1.0 - fVar29;
      fVar36 = fVar32 * fVar30 + fVar37 * fVar29;
      fVar34 = fVar34 * fVar30 + fVar24 * fVar29;
      fVar35 = fVar35 * fVar30 + fVar26 * fVar29;
      fVar29 = fVar31 * fVar30 + fVar27 * fVar29;
      goto LAB_00d6d91a;
    }
  }
  patch->items[2].ring.items[2].edge_level = (this->ring).items[2].edge_level * 0.5;
  patch->items[2].ring.items[2].vertex_level = (this->ring).items[2].vertex_level * 0.5;
  patch->items[2].ring.items[2].face_valence = (this->ring).items[2].face_valence;
  patch->items[2].ring.items[2].edge_valence = (this->ring).items[2].edge_valence;
  patch->items[2].ring.items[2].border_index = (this->ring).items[2].border_index;
  fVar29 = (this->ring).items[2].vertex_crease_weight + -1.0;
  if (fVar29 <= 0.0) {
    fVar29 = 0.0;
  }
  patch->items[2].ring.items[2].vertex_crease_weight = fVar29;
  patch->items[2].ring.items[2].eval_start_index = (this->ring).items[2].eval_start_index;
  patch->items[2].ring.items[2].eval_unique_identifier =
       (this->ring).items[2].eval_unique_identifier;
  uVar16 = (ulong)(this->ring).items[2].face_valence;
  if (uVar16 == 0) {
    fVar29 = 0.0;
    fVar34 = 0.0;
    fVar35 = 0.0;
    fVar36 = 0.0;
LAB_00d6b626:
    fVar30 = 0.0;
    uVar23 = 0;
  }
  else {
    pDVar2 = &patch->items[2].ring.items[2].ring;
    fVar29 = 0.0;
    fVar34 = 0.0;
    fVar35 = 0.0;
    fVar36 = 0.0;
    uVar20 = 0;
    uVar23 = 0;
    do {
      uVar15 = (ulong)(this->ring).items[2].edge_valence;
      uVar18 = (this->ring).items[2].eval_start_index + uVar23;
      if (uVar18 < uVar16) {
        uVar16 = uVar20;
      }
      lVar19 = uVar18 - uVar16;
      uVar16 = uVar15;
      if ((ulong)(lVar19 * 2) < uVar15) {
        uVar16 = uVar20;
      }
      uVar18 = lVar19 * 2 + 1;
      uVar22 = uVar15;
      if (uVar18 < uVar15) {
        uVar22 = uVar20;
      }
      lVar10 = uVar18 - uVar22;
      uVar18 = lVar19 * 2 + 2;
      if (uVar18 < uVar15) {
        uVar15 = uVar20;
      }
      pVVar7 = (this->ring).items[2].ring.data;
      pVVar12 = pVVar7 + lVar10;
      pVVar11 = pVVar7 + (lVar19 * 2 - uVar16);
      pVVar7 = pVVar7 + (uVar18 - uVar15);
      fVar30 = ((pVVar11->field_0).m128[0] + (pVVar7->field_0).m128[0] +
               (this->ring).items[2].vtx.field_0.m128[0] + (pVVar12->field_0).m128[0]) * 0.25;
      fVar31 = ((pVVar11->field_0).m128[1] + (pVVar7->field_0).m128[1] +
               (this->ring).items[2].vtx.field_0.m128[1] + (pVVar12->field_0).m128[1]) * 0.25;
      fVar32 = ((pVVar11->field_0).m128[2] + (pVVar7->field_0).m128[2] +
               (this->ring).items[2].vtx.field_0.m128[2] + (pVVar12->field_0).m128[2]) * 0.25;
      fVar33 = ((pVVar11->field_0).m128[3] + (pVVar7->field_0).m128[3] +
               (this->ring).items[2].vtx.field_0.m128[3] + (pVVar12->field_0).m128[3]) * 0.25;
      pVVar12 = patch->items[2].ring.items[2].ring.data;
      if ((0x20 < lVar10 + 1U) &&
         ((DynamicStackArray<embree::Vec3fa,_32UL,_128UL> *)pVVar12 == pDVar2)) {
        pVVar12 = (Vec3fa *)alignedMalloc(0x800,0x10);
        patch->items[2].ring.items[2].ring.data = pVVar12;
        lVar19 = 0;
        do {
          puVar5 = (undefined8 *)((long)&patch->items[2].ring.items[2].ring.arr[0].field_0 + lVar19)
          ;
          uVar8 = puVar5[1];
          puVar3 = (undefined8 *)
                   ((long)&(patch->items[2].ring.items[2].ring.data)->field_0 + lVar19);
          *puVar3 = *puVar5;
          puVar3[1] = uVar8;
          lVar19 = lVar19 + 0x10;
        } while (lVar19 != 0x200);
        pVVar12 = patch->items[2].ring.items[2].ring.data;
      }
      pVVar12 = pVVar12 + lVar10;
      (pVVar12->field_0).m128[0] = fVar30;
      (pVVar12->field_0).m128[1] = fVar31;
      (pVVar12->field_0).m128[2] = fVar32;
      (pVVar12->field_0).m128[3] = fVar33;
      fVar29 = fVar29 + fVar30;
      fVar34 = fVar34 + fVar31;
      fVar35 = fVar35 + fVar32;
      fVar36 = fVar36 + fVar33;
      uVar23 = uVar23 + 1;
      uVar16 = (ulong)(this->ring).items[2].face_valence;
    } while (uVar23 < uVar16);
    if (uVar16 == 0) goto LAB_00d6b626;
    uVar23 = 0;
    uVar20 = 0;
    do {
      uVar18 = (this->ring).items[2].eval_start_index + uVar20;
      uVar15 = 0;
      if (uVar16 <= uVar18) {
        uVar15 = uVar16;
      }
      lVar19 = uVar18 - uVar15;
      fVar30 = (this->ring).items[2].crease_weight.data[lVar19];
      pfVar14 = patch->items[2].ring.items[2].crease_weight.data;
      if ((0x10 < lVar19 + 1U) &&
         ((DynamicStackArray<float,_16UL,_64UL> *)pfVar14 ==
          &patch->items[2].ring.items[2].crease_weight)) {
        pfVar14 = (float *)operator_new__(0x100);
        patch->items[2].ring.items[2].crease_weight.data = pfVar14;
        lVar10 = 0;
        do {
          patch->items[2].ring.items[2].crease_weight.data[lVar10] =
               patch->items[2].ring.items[2].crease_weight.arr[lVar10];
          lVar10 = lVar10 + 1;
        } while (lVar10 != 0x10);
        pfVar14 = patch->items[2].ring.items[2].crease_weight.data;
      }
      fVar31 = 0.0;
      if (0.0 <= fVar30 + -1.0) {
        fVar31 = fVar30 + -1.0;
      }
      pfVar14[lVar19] = fVar31;
      uVar16 = lVar19 * 2 - 1;
      if (uVar18 == uVar15) {
        uVar16 = (ulong)((this->ring).items[2].edge_valence - 1);
      }
      pVVar12 = (this->ring).items[2].ring.data + lVar19 * 2;
      fVar31 = (this->ring).items[2].vtx.field_0.m128[0] + (pVVar12->field_0).m128[0];
      fVar32 = (this->ring).items[2].vtx.field_0.m128[1] + (pVVar12->field_0).m128[1];
      fVar33 = (this->ring).items[2].vtx.field_0.m128[2] + (pVVar12->field_0).m128[2];
      fVar37 = (this->ring).items[2].vtx.field_0.m128[3] + (pVVar12->field_0).m128[3];
      pVVar12 = patch->items[2].ring.items[2].ring.data;
      if ((0x20 < uVar16 + 1) &&
         ((DynamicStackArray<embree::Vec3fa,_32UL,_128UL> *)pVVar12 == pDVar2)) {
        pVVar12 = (Vec3fa *)alignedMalloc(0x800,0x10);
        patch->items[2].ring.items[2].ring.data = pVVar12;
        lVar10 = 0;
        do {
          puVar5 = (undefined8 *)((long)&patch->items[2].ring.items[2].ring.arr[0].field_0 + lVar10)
          ;
          uVar8 = puVar5[1];
          puVar3 = (undefined8 *)
                   ((long)&(patch->items[2].ring.items[2].ring.data)->field_0 + lVar10);
          *puVar3 = *puVar5;
          puVar3[1] = uVar8;
          lVar10 = lVar10 + 0x10;
        } while (lVar10 != 0x200);
        pVVar12 = patch->items[2].ring.items[2].ring.data;
      }
      pVVar11 = pVVar12;
      if ((0x20 < lVar19 * 2 + 2U) &&
         ((DynamicStackArray<embree::Vec3fa,_32UL,_128UL> *)pVVar12 == pDVar2)) {
        pVVar11 = (Vec3fa *)alignedMalloc(0x800,0x10);
        patch->items[2].ring.items[2].ring.data = pVVar11;
        lVar10 = 0;
        do {
          puVar5 = (undefined8 *)((long)&patch->items[2].ring.items[2].ring.arr[0].field_0 + lVar10)
          ;
          uVar8 = puVar5[1];
          puVar3 = (undefined8 *)
                   ((long)&(patch->items[2].ring.items[2].ring.data)->field_0 + lVar10);
          *puVar3 = *puVar5;
          puVar3[1] = uVar8;
          lVar10 = lVar10 + 0x10;
        } while (lVar10 != 0x200);
        pVVar11 = patch->items[2].ring.items[2].ring.data;
      }
      uVar15 = lVar19 * 2 + 1;
      pVVar12 = pVVar12 + uVar16;
      pVVar7 = pVVar11 + uVar15;
      fVar24 = (pVVar12->field_0).m128[0] + (pVVar7->field_0).m128[0];
      fVar26 = (pVVar12->field_0).m128[1] + (pVVar7->field_0).m128[1];
      fVar27 = (pVVar12->field_0).m128[2] + (pVVar7->field_0).m128[2];
      fVar28 = (pVVar12->field_0).m128[3] + (pVVar7->field_0).m128[3];
      pVVar12 = (this->ring).items[2].ring.data + lVar19 * 2;
      fVar29 = fVar29 + (pVVar12->field_0).m128[0];
      fVar34 = fVar34 + (pVVar12->field_0).m128[1];
      fVar35 = fVar35 + (pVVar12->field_0).m128[2];
      fVar36 = fVar36 + (pVVar12->field_0).m128[3];
      if (0.0 < fVar30) {
        local_238[uVar23] = lVar19;
        if ((0x20 < uVar15) && ((DynamicStackArray<embree::Vec3fa,_32UL,_128UL> *)pVVar11 == pDVar2)
           ) {
          pVVar12 = (Vec3fa *)alignedMalloc(0x800,0x10);
          patch->items[2].ring.items[2].ring.data = pVVar12;
          lVar10 = 0;
          do {
            puVar5 = (undefined8 *)
                     ((long)&patch->items[2].ring.items[2].ring.arr[0].field_0 + lVar10);
            uVar8 = puVar5[1];
            puVar3 = (undefined8 *)
                     ((long)&(patch->items[2].ring.items[2].ring.data)->field_0 + lVar10);
            *puVar3 = *puVar5;
            puVar3[1] = uVar8;
            lVar10 = lVar10 + 0x10;
          } while (lVar10 != 0x200);
          pVVar11 = patch->items[2].ring.items[2].ring.data;
        }
        uVar23 = uVar23 + 1;
        pVVar11 = pVVar11 + lVar19 * 2;
        (pVVar11->field_0).m128[0] = fVar31 * 0.5;
        (pVVar11->field_0).m128[1] = fVar32 * 0.5;
        (pVVar11->field_0).m128[2] = fVar33 * 0.5;
        (pVVar11->field_0).m128[3] = fVar37 * 0.5;
        if (fVar30 < 1.0) {
          fVar25 = 1.0 - fVar30;
          fVar31 = (fVar31 + fVar24) * 0.25 * fVar25 + fVar30 * fVar31 * 0.5;
          fVar32 = (fVar32 + fVar26) * 0.25 * fVar25 + fVar30 * fVar32 * 0.5;
          fVar33 = (fVar33 + fVar27) * 0.25 * fVar25 + fVar30 * fVar33 * 0.5;
          fVar30 = (fVar37 + fVar28) * 0.25 * fVar25 + fVar30 * fVar37 * 0.5;
          pVVar11 = patch->items[2].ring.items[2].ring.data;
          if ((0x20 < uVar15) &&
             ((DynamicStackArray<embree::Vec3fa,_32UL,_128UL> *)pVVar11 == pDVar2)) {
            pVVar12 = (Vec3fa *)alignedMalloc(0x800,0x10);
            patch->items[2].ring.items[2].ring.data = pVVar12;
            lVar10 = 0;
            do {
              puVar5 = (undefined8 *)
                       ((long)&patch->items[2].ring.items[2].ring.arr[0].field_0 + lVar10);
              uVar8 = puVar5[1];
              puVar3 = (undefined8 *)
                       ((long)&(patch->items[2].ring.items[2].ring.data)->field_0 + lVar10);
              *puVar3 = *puVar5;
              puVar3[1] = uVar8;
              lVar10 = lVar10 + 0x10;
            } while (lVar10 != 0x200);
            pVVar11 = patch->items[2].ring.items[2].ring.data;
          }
          goto LAB_00d6b13c;
        }
      }
      else {
        fVar31 = (fVar31 + fVar24) * 0.25;
        fVar32 = (fVar32 + fVar26) * 0.25;
        fVar33 = (fVar33 + fVar27) * 0.25;
        fVar30 = (fVar37 + fVar28) * 0.25;
        if ((0x20 < uVar15) && ((DynamicStackArray<embree::Vec3fa,_32UL,_128UL> *)pVVar11 == pDVar2)
           ) {
          pVVar12 = (Vec3fa *)alignedMalloc(0x800,0x10);
          patch->items[2].ring.items[2].ring.data = pVVar12;
          lVar10 = 0;
          do {
            puVar5 = (undefined8 *)
                     ((long)&patch->items[2].ring.items[2].ring.arr[0].field_0 + lVar10);
            uVar8 = puVar5[1];
            puVar3 = (undefined8 *)
                     ((long)&(patch->items[2].ring.items[2].ring.data)->field_0 + lVar10);
            *puVar3 = *puVar5;
            puVar3[1] = uVar8;
            lVar10 = lVar10 + 0x10;
          } while (lVar10 != 0x200);
          pVVar11 = patch->items[2].ring.items[2].ring.data;
        }
LAB_00d6b13c:
        pVVar11 = pVVar11 + lVar19 * 2;
        (pVVar11->field_0).m128[0] = fVar31;
        (pVVar11->field_0).m128[1] = fVar32;
        (pVVar11->field_0).m128[2] = fVar33;
        (pVVar11->field_0).m128[3] = fVar30;
      }
      uVar20 = uVar20 + 1;
      uVar16 = (ulong)(this->ring).items[2].face_valence;
    } while (uVar20 < uVar16);
    fVar30 = (float)uVar16;
  }
  lVar10 = local_238[1];
  lVar19 = local_238[0];
  fVar31 = 1.0 / fVar30;
  fVar30 = fVar30 + -2.0;
  fVar32 = (fVar29 * fVar31 + fVar30 * (this->ring).items[2].vtx.field_0.m128[0]) * fVar31;
  fVar34 = (fVar34 * fVar31 + fVar30 * (this->ring).items[2].vtx.field_0.m128[1]) * fVar31;
  fVar35 = (fVar35 * fVar31 + fVar30 * (this->ring).items[2].vtx.field_0.m128[2]) * fVar31;
  fVar31 = (fVar36 * fVar31 + fVar30 * (this->ring).items[2].vtx.field_0.m128[3]) * fVar31;
  patch->items[2].ring.items[2].vtx.field_0.m128[0] = fVar32;
  patch->items[2].ring.items[2].vtx.field_0.m128[1] = fVar34;
  patch->items[2].ring.items[2].vtx.field_0.m128[2] = fVar35;
  patch->items[2].ring.items[2].vtx.field_0.m128[3] = fVar31;
  fVar29 = (this->ring).items[2].vertex_crease_weight;
  if (0.0 < fVar29) {
    if (1.0 <= fVar29) {
LAB_00d6d927:
      fVar36 = (this->ring).items[2].vtx.field_0.m128[0];
      fVar34 = (this->ring).items[2].vtx.field_0.m128[1];
      fVar35 = (this->ring).items[2].vtx.field_0.m128[2];
      fVar29 = (this->ring).items[2].vtx.field_0.m128[3];
    }
    else {
      fVar30 = 1.0 - fVar29;
      fVar36 = fVar32 * fVar30 + fVar29 * (this->ring).items[2].vtx.field_0.m128[0];
      fVar34 = fVar34 * fVar30 + fVar29 * (this->ring).items[2].vtx.field_0.m128[1];
      fVar35 = fVar35 * fVar30 + fVar29 * (this->ring).items[2].vtx.field_0.m128[2];
      fVar29 = fVar31 * fVar30 + fVar29 * (this->ring).items[2].vtx.field_0.m128[3];
    }
LAB_00d6d92f:
    patch->items[2].ring.items[2].vtx.field_0.m128[0] = fVar36;
    patch->items[2].ring.items[2].vtx.field_0.m128[1] = fVar34;
    patch->items[2].ring.items[2].vtx.field_0.m128[2] = fVar35;
    patch->items[2].ring.items[2].vtx.field_0.m128[3] = fVar29;
  }
  else if (1 < uVar23) {
    if (uVar23 != 2) goto LAB_00d6d927;
    pVVar11 = (this->ring).items[2].ring.data;
    pVVar12 = pVVar11 + local_238[0] * 2;
    pVVar11 = pVVar11 + local_238[1] * 2;
    fVar37 = ((this->ring).items[2].vtx.field_0.m128[0] * 6.0 + (pVVar12->field_0).m128[0] +
             (pVVar11->field_0).m128[0]) * 0.125;
    fVar24 = ((this->ring).items[2].vtx.field_0.m128[1] * 6.0 + (pVVar12->field_0).m128[1] +
             (pVVar11->field_0).m128[1]) * 0.125;
    fVar26 = ((this->ring).items[2].vtx.field_0.m128[2] * 6.0 + (pVVar12->field_0).m128[2] +
             (pVVar11->field_0).m128[2]) * 0.125;
    fVar27 = ((this->ring).items[2].vtx.field_0.m128[3] * 6.0 + (pVVar12->field_0).m128[3] +
             (pVVar11->field_0).m128[3]) * 0.125;
    patch->items[2].ring.items[2].vtx.field_0.m128[0] = fVar37;
    patch->items[2].ring.items[2].vtx.field_0.m128[1] = fVar24;
    patch->items[2].ring.items[2].vtx.field_0.m128[2] = fVar26;
    patch->items[2].ring.items[2].vtx.field_0.m128[3] = fVar27;
    pfVar14 = (this->ring).items[2].crease_weight.data;
    fVar29 = pfVar14[local_238[0]];
    fVar36 = pfVar14[local_238[1]];
    fVar33 = (fVar29 * 3.0 + fVar36) * 0.25 + -1.0;
    fVar30 = 0.0;
    if (0.0 <= fVar33) {
      fVar30 = fVar33;
    }
    pDVar1 = &patch->items[2].ring.items[2].crease_weight;
    if ((0x10 < local_238[0] + 1U) &&
       ((DynamicStackArray<float,_16UL,_64UL> *)patch->items[2].ring.items[2].crease_weight.data ==
        pDVar1)) {
      pfVar14 = (float *)operator_new__(0x100);
      patch->items[2].ring.items[2].crease_weight.data = pfVar14;
      lVar13 = 0;
      do {
        patch->items[2].ring.items[2].crease_weight.data[lVar13] =
             patch->items[2].ring.items[2].crease_weight.arr[lVar13];
        lVar13 = lVar13 + 1;
      } while (lVar13 != 0x10);
    }
    patch->items[2].ring.items[2].crease_weight.data[lVar19] = fVar30;
    fVar33 = (fVar36 * 3.0 + fVar29) * 0.25 + -1.0;
    fVar30 = 0.0;
    if (0.0 <= fVar33) {
      fVar30 = fVar33;
    }
    pfVar14 = patch->items[2].ring.items[2].crease_weight.data;
    if ((0x10 < lVar10 + 1U) && ((DynamicStackArray<float,_16UL,_64UL> *)pfVar14 == pDVar1)) {
      pfVar14 = (float *)operator_new__(0x100);
      patch->items[2].ring.items[2].crease_weight.data = pfVar14;
      lVar19 = 0;
      do {
        patch->items[2].ring.items[2].crease_weight.data[lVar19] =
             patch->items[2].ring.items[2].crease_weight.arr[lVar19];
        lVar19 = lVar19 + 1;
      } while (lVar19 != 0x10);
      pfVar14 = patch->items[2].ring.items[2].crease_weight.data;
    }
    pfVar14[lVar10] = fVar30;
    fVar29 = (fVar29 + fVar36) * 0.5;
    if (fVar29 < 1.0) {
      fVar30 = 1.0 - fVar29;
      fVar36 = fVar32 * fVar30 + fVar37 * fVar29;
      fVar34 = fVar34 * fVar30 + fVar24 * fVar29;
      fVar35 = fVar35 * fVar30 + fVar26 * fVar29;
      fVar29 = fVar31 * fVar30 + fVar27 * fVar29;
      goto LAB_00d6d92f;
    }
  }
  patch->items[3].ring.items[3].edge_level = (this->ring).items[3].edge_level * 0.5;
  patch->items[3].ring.items[3].vertex_level = (this->ring).items[3].vertex_level * 0.5;
  patch->items[3].ring.items[3].face_valence = (this->ring).items[3].face_valence;
  patch->items[3].ring.items[3].edge_valence = (this->ring).items[3].edge_valence;
  patch->items[3].ring.items[3].border_index = (this->ring).items[3].border_index;
  fVar29 = (this->ring).items[3].vertex_crease_weight + -1.0;
  if (fVar29 <= 0.0) {
    fVar29 = 0.0;
  }
  patch->items[3].ring.items[3].vertex_crease_weight = fVar29;
  patch->items[3].ring.items[3].eval_start_index = (this->ring).items[3].eval_start_index;
  patch->items[3].ring.items[3].eval_unique_identifier =
       (this->ring).items[3].eval_unique_identifier;
  uVar16 = (ulong)(this->ring).items[3].face_valence;
  if (uVar16 == 0) {
    fVar29 = 0.0;
    fVar34 = 0.0;
    fVar35 = 0.0;
    fVar36 = 0.0;
LAB_00d6be72:
    fVar30 = 0.0;
    uVar23 = 0;
  }
  else {
    pDVar2 = &patch->items[3].ring.items[3].ring;
    fVar29 = 0.0;
    fVar34 = 0.0;
    fVar35 = 0.0;
    fVar36 = 0.0;
    uVar20 = 0;
    uVar23 = 0;
    do {
      uVar15 = (ulong)(this->ring).items[3].edge_valence;
      uVar18 = (this->ring).items[3].eval_start_index + uVar23;
      if (uVar18 < uVar16) {
        uVar16 = uVar20;
      }
      lVar19 = uVar18 - uVar16;
      uVar16 = uVar15;
      if ((ulong)(lVar19 * 2) < uVar15) {
        uVar16 = uVar20;
      }
      uVar18 = lVar19 * 2 + 1;
      uVar22 = uVar15;
      if (uVar18 < uVar15) {
        uVar22 = uVar20;
      }
      lVar10 = uVar18 - uVar22;
      uVar18 = lVar19 * 2 + 2;
      if (uVar18 < uVar15) {
        uVar15 = uVar20;
      }
      pVVar7 = (this->ring).items[3].ring.data;
      pVVar12 = pVVar7 + lVar10;
      pVVar11 = pVVar7 + (lVar19 * 2 - uVar16);
      pVVar7 = pVVar7 + (uVar18 - uVar15);
      fVar30 = ((pVVar11->field_0).m128[0] + (pVVar7->field_0).m128[0] +
               (this->ring).items[3].vtx.field_0.m128[0] + (pVVar12->field_0).m128[0]) * 0.25;
      fVar31 = ((pVVar11->field_0).m128[1] + (pVVar7->field_0).m128[1] +
               (this->ring).items[3].vtx.field_0.m128[1] + (pVVar12->field_0).m128[1]) * 0.25;
      fVar32 = ((pVVar11->field_0).m128[2] + (pVVar7->field_0).m128[2] +
               (this->ring).items[3].vtx.field_0.m128[2] + (pVVar12->field_0).m128[2]) * 0.25;
      fVar33 = ((pVVar11->field_0).m128[3] + (pVVar7->field_0).m128[3] +
               (this->ring).items[3].vtx.field_0.m128[3] + (pVVar12->field_0).m128[3]) * 0.25;
      pVVar12 = patch->items[3].ring.items[3].ring.data;
      if ((0x20 < lVar10 + 1U) &&
         ((DynamicStackArray<embree::Vec3fa,_32UL,_128UL> *)pVVar12 == pDVar2)) {
        pVVar12 = (Vec3fa *)alignedMalloc(0x800,0x10);
        patch->items[3].ring.items[3].ring.data = pVVar12;
        lVar19 = 0;
        do {
          puVar5 = (undefined8 *)((long)&patch->items[3].ring.items[3].ring.arr[0].field_0 + lVar19)
          ;
          uVar8 = puVar5[1];
          puVar3 = (undefined8 *)
                   ((long)&(patch->items[3].ring.items[3].ring.data)->field_0 + lVar19);
          *puVar3 = *puVar5;
          puVar3[1] = uVar8;
          lVar19 = lVar19 + 0x10;
        } while (lVar19 != 0x200);
        pVVar12 = patch->items[3].ring.items[3].ring.data;
      }
      pVVar12 = pVVar12 + lVar10;
      (pVVar12->field_0).m128[0] = fVar30;
      (pVVar12->field_0).m128[1] = fVar31;
      (pVVar12->field_0).m128[2] = fVar32;
      (pVVar12->field_0).m128[3] = fVar33;
      fVar29 = fVar29 + fVar30;
      fVar34 = fVar34 + fVar31;
      fVar35 = fVar35 + fVar32;
      fVar36 = fVar36 + fVar33;
      uVar23 = uVar23 + 1;
      uVar16 = (ulong)(this->ring).items[3].face_valence;
    } while (uVar23 < uVar16);
    if (uVar16 == 0) goto LAB_00d6be72;
    uVar23 = 0;
    uVar20 = 0;
    do {
      uVar18 = (this->ring).items[3].eval_start_index + uVar20;
      uVar15 = 0;
      if (uVar16 <= uVar18) {
        uVar15 = uVar16;
      }
      lVar19 = uVar18 - uVar15;
      fVar30 = (this->ring).items[3].crease_weight.data[lVar19];
      pfVar14 = patch->items[3].ring.items[3].crease_weight.data;
      if ((0x10 < lVar19 + 1U) &&
         ((DynamicStackArray<float,_16UL,_64UL> *)pfVar14 ==
          &patch->items[3].ring.items[3].crease_weight)) {
        pfVar14 = (float *)operator_new__(0x100);
        patch->items[3].ring.items[3].crease_weight.data = pfVar14;
        lVar10 = 0;
        do {
          patch->items[3].ring.items[3].crease_weight.data[lVar10] =
               patch->items[3].ring.items[3].crease_weight.arr[lVar10];
          lVar10 = lVar10 + 1;
        } while (lVar10 != 0x10);
        pfVar14 = patch->items[3].ring.items[3].crease_weight.data;
      }
      fVar31 = 0.0;
      if (0.0 <= fVar30 + -1.0) {
        fVar31 = fVar30 + -1.0;
      }
      pfVar14[lVar19] = fVar31;
      uVar16 = lVar19 * 2 - 1;
      if (uVar18 == uVar15) {
        uVar16 = (ulong)((this->ring).items[3].edge_valence - 1);
      }
      pVVar12 = (this->ring).items[3].ring.data + lVar19 * 2;
      fVar31 = (this->ring).items[3].vtx.field_0.m128[0] + (pVVar12->field_0).m128[0];
      fVar32 = (this->ring).items[3].vtx.field_0.m128[1] + (pVVar12->field_0).m128[1];
      fVar33 = (this->ring).items[3].vtx.field_0.m128[2] + (pVVar12->field_0).m128[2];
      fVar37 = (this->ring).items[3].vtx.field_0.m128[3] + (pVVar12->field_0).m128[3];
      pVVar12 = patch->items[3].ring.items[3].ring.data;
      if ((0x20 < uVar16 + 1) &&
         ((DynamicStackArray<embree::Vec3fa,_32UL,_128UL> *)pVVar12 == pDVar2)) {
        pVVar12 = (Vec3fa *)alignedMalloc(0x800,0x10);
        patch->items[3].ring.items[3].ring.data = pVVar12;
        lVar10 = 0;
        do {
          puVar5 = (undefined8 *)((long)&patch->items[3].ring.items[3].ring.arr[0].field_0 + lVar10)
          ;
          uVar8 = puVar5[1];
          puVar3 = (undefined8 *)
                   ((long)&(patch->items[3].ring.items[3].ring.data)->field_0 + lVar10);
          *puVar3 = *puVar5;
          puVar3[1] = uVar8;
          lVar10 = lVar10 + 0x10;
        } while (lVar10 != 0x200);
        pVVar12 = patch->items[3].ring.items[3].ring.data;
      }
      pVVar11 = pVVar12;
      if ((0x20 < lVar19 * 2 + 2U) &&
         ((DynamicStackArray<embree::Vec3fa,_32UL,_128UL> *)pVVar12 == pDVar2)) {
        pVVar11 = (Vec3fa *)alignedMalloc(0x800,0x10);
        patch->items[3].ring.items[3].ring.data = pVVar11;
        lVar10 = 0;
        do {
          puVar5 = (undefined8 *)((long)&patch->items[3].ring.items[3].ring.arr[0].field_0 + lVar10)
          ;
          uVar8 = puVar5[1];
          puVar3 = (undefined8 *)
                   ((long)&(patch->items[3].ring.items[3].ring.data)->field_0 + lVar10);
          *puVar3 = *puVar5;
          puVar3[1] = uVar8;
          lVar10 = lVar10 + 0x10;
        } while (lVar10 != 0x200);
        pVVar11 = patch->items[3].ring.items[3].ring.data;
      }
      uVar15 = lVar19 * 2 + 1;
      pVVar12 = pVVar12 + uVar16;
      pVVar7 = pVVar11 + uVar15;
      fVar24 = (pVVar12->field_0).m128[0] + (pVVar7->field_0).m128[0];
      fVar26 = (pVVar12->field_0).m128[1] + (pVVar7->field_0).m128[1];
      fVar27 = (pVVar12->field_0).m128[2] + (pVVar7->field_0).m128[2];
      fVar28 = (pVVar12->field_0).m128[3] + (pVVar7->field_0).m128[3];
      pVVar12 = (this->ring).items[3].ring.data + lVar19 * 2;
      fVar29 = fVar29 + (pVVar12->field_0).m128[0];
      fVar34 = fVar34 + (pVVar12->field_0).m128[1];
      fVar35 = fVar35 + (pVVar12->field_0).m128[2];
      fVar36 = fVar36 + (pVVar12->field_0).m128[3];
      if (0.0 < fVar30) {
        local_238[uVar23] = lVar19;
        if ((0x20 < uVar15) && ((DynamicStackArray<embree::Vec3fa,_32UL,_128UL> *)pVVar11 == pDVar2)
           ) {
          pVVar12 = (Vec3fa *)alignedMalloc(0x800,0x10);
          patch->items[3].ring.items[3].ring.data = pVVar12;
          lVar10 = 0;
          do {
            puVar5 = (undefined8 *)
                     ((long)&patch->items[3].ring.items[3].ring.arr[0].field_0 + lVar10);
            uVar8 = puVar5[1];
            puVar3 = (undefined8 *)
                     ((long)&(patch->items[3].ring.items[3].ring.data)->field_0 + lVar10);
            *puVar3 = *puVar5;
            puVar3[1] = uVar8;
            lVar10 = lVar10 + 0x10;
          } while (lVar10 != 0x200);
          pVVar11 = patch->items[3].ring.items[3].ring.data;
        }
        uVar23 = uVar23 + 1;
        pVVar11 = pVVar11 + lVar19 * 2;
        (pVVar11->field_0).m128[0] = fVar31 * 0.5;
        (pVVar11->field_0).m128[1] = fVar32 * 0.5;
        (pVVar11->field_0).m128[2] = fVar33 * 0.5;
        (pVVar11->field_0).m128[3] = fVar37 * 0.5;
        if (fVar30 < 1.0) {
          fVar25 = 1.0 - fVar30;
          fVar31 = (fVar31 + fVar24) * 0.25 * fVar25 + fVar30 * fVar31 * 0.5;
          fVar32 = (fVar32 + fVar26) * 0.25 * fVar25 + fVar30 * fVar32 * 0.5;
          fVar33 = (fVar33 + fVar27) * 0.25 * fVar25 + fVar30 * fVar33 * 0.5;
          fVar30 = (fVar37 + fVar28) * 0.25 * fVar25 + fVar30 * fVar37 * 0.5;
          pVVar11 = patch->items[3].ring.items[3].ring.data;
          if ((0x20 < uVar15) &&
             ((DynamicStackArray<embree::Vec3fa,_32UL,_128UL> *)pVVar11 == pDVar2)) {
            pVVar12 = (Vec3fa *)alignedMalloc(0x800,0x10);
            patch->items[3].ring.items[3].ring.data = pVVar12;
            lVar10 = 0;
            do {
              puVar5 = (undefined8 *)
                       ((long)&patch->items[3].ring.items[3].ring.arr[0].field_0 + lVar10);
              uVar8 = puVar5[1];
              puVar3 = (undefined8 *)
                       ((long)&(patch->items[3].ring.items[3].ring.data)->field_0 + lVar10);
              *puVar3 = *puVar5;
              puVar3[1] = uVar8;
              lVar10 = lVar10 + 0x10;
            } while (lVar10 != 0x200);
            pVVar11 = patch->items[3].ring.items[3].ring.data;
          }
          goto LAB_00d6b988;
        }
      }
      else {
        fVar31 = (fVar31 + fVar24) * 0.25;
        fVar32 = (fVar32 + fVar26) * 0.25;
        fVar33 = (fVar33 + fVar27) * 0.25;
        fVar30 = (fVar37 + fVar28) * 0.25;
        if ((0x20 < uVar15) && ((DynamicStackArray<embree::Vec3fa,_32UL,_128UL> *)pVVar11 == pDVar2)
           ) {
          pVVar12 = (Vec3fa *)alignedMalloc(0x800,0x10);
          patch->items[3].ring.items[3].ring.data = pVVar12;
          lVar10 = 0;
          do {
            puVar5 = (undefined8 *)
                     ((long)&patch->items[3].ring.items[3].ring.arr[0].field_0 + lVar10);
            uVar8 = puVar5[1];
            puVar3 = (undefined8 *)
                     ((long)&(patch->items[3].ring.items[3].ring.data)->field_0 + lVar10);
            *puVar3 = *puVar5;
            puVar3[1] = uVar8;
            lVar10 = lVar10 + 0x10;
          } while (lVar10 != 0x200);
          pVVar11 = patch->items[3].ring.items[3].ring.data;
        }
LAB_00d6b988:
        pVVar11 = pVVar11 + lVar19 * 2;
        (pVVar11->field_0).m128[0] = fVar31;
        (pVVar11->field_0).m128[1] = fVar32;
        (pVVar11->field_0).m128[2] = fVar33;
        (pVVar11->field_0).m128[3] = fVar30;
      }
      uVar20 = uVar20 + 1;
      uVar16 = (ulong)(this->ring).items[3].face_valence;
    } while (uVar20 < uVar16);
    fVar30 = (float)uVar16;
  }
  fVar31 = 1.0 / fVar30;
  fVar30 = fVar30 + -2.0;
  fVar32 = (fVar29 * fVar31 + fVar30 * (this->ring).items[3].vtx.field_0.m128[0]) * fVar31;
  fVar34 = (fVar34 * fVar31 + fVar30 * (this->ring).items[3].vtx.field_0.m128[1]) * fVar31;
  fVar35 = (fVar35 * fVar31 + fVar30 * (this->ring).items[3].vtx.field_0.m128[2]) * fVar31;
  fVar31 = (fVar36 * fVar31 + fVar30 * (this->ring).items[3].vtx.field_0.m128[3]) * fVar31;
  patch->items[3].ring.items[3].vtx.field_0.m128[0] = fVar32;
  patch->items[3].ring.items[3].vtx.field_0.m128[1] = fVar34;
  patch->items[3].ring.items[3].vtx.field_0.m128[2] = fVar35;
  patch->items[3].ring.items[3].vtx.field_0.m128[3] = fVar31;
  fVar29 = (this->ring).items[3].vertex_crease_weight;
  if (0.0 < fVar29) {
    if (1.0 <= fVar29) {
LAB_00d6d93c:
      fVar36 = (this->ring).items[3].vtx.field_0.m128[0];
      fVar34 = (this->ring).items[3].vtx.field_0.m128[1];
      fVar35 = (this->ring).items[3].vtx.field_0.m128[2];
      fVar29 = (this->ring).items[3].vtx.field_0.m128[3];
    }
    else {
      fVar30 = 1.0 - fVar29;
      fVar36 = fVar32 * fVar30 + fVar29 * (this->ring).items[3].vtx.field_0.m128[0];
      fVar34 = fVar34 * fVar30 + fVar29 * (this->ring).items[3].vtx.field_0.m128[1];
      fVar35 = fVar35 * fVar30 + fVar29 * (this->ring).items[3].vtx.field_0.m128[2];
      fVar29 = fVar31 * fVar30 + fVar29 * (this->ring).items[3].vtx.field_0.m128[3];
    }
LAB_00d6d944:
    patch->items[3].ring.items[3].vtx.field_0.m128[0] = fVar36;
    patch->items[3].ring.items[3].vtx.field_0.m128[1] = fVar34;
    patch->items[3].ring.items[3].vtx.field_0.m128[2] = fVar35;
    patch->items[3].ring.items[3].vtx.field_0.m128[3] = fVar29;
  }
  else if (1 < uVar23) {
    if (uVar23 != 2) goto LAB_00d6d93c;
    pVVar11 = (this->ring).items[3].ring.data;
    pVVar12 = pVVar11 + local_238[0] * 2;
    pVVar11 = pVVar11 + local_238[1] * 2;
    fVar37 = ((this->ring).items[3].vtx.field_0.m128[0] * 6.0 + (pVVar12->field_0).m128[0] +
             (pVVar11->field_0).m128[0]) * 0.125;
    fVar24 = ((this->ring).items[3].vtx.field_0.m128[1] * 6.0 + (pVVar12->field_0).m128[1] +
             (pVVar11->field_0).m128[1]) * 0.125;
    fVar26 = ((this->ring).items[3].vtx.field_0.m128[2] * 6.0 + (pVVar12->field_0).m128[2] +
             (pVVar11->field_0).m128[2]) * 0.125;
    fVar27 = ((this->ring).items[3].vtx.field_0.m128[3] * 6.0 + (pVVar12->field_0).m128[3] +
             (pVVar11->field_0).m128[3]) * 0.125;
    patch->items[3].ring.items[3].vtx.field_0.m128[0] = fVar37;
    patch->items[3].ring.items[3].vtx.field_0.m128[1] = fVar24;
    patch->items[3].ring.items[3].vtx.field_0.m128[2] = fVar26;
    patch->items[3].ring.items[3].vtx.field_0.m128[3] = fVar27;
    pfVar14 = (this->ring).items[3].crease_weight.data;
    fVar29 = pfVar14[local_238[0]];
    fVar36 = pfVar14[local_238[1]];
    fVar33 = (fVar29 * 3.0 + fVar36) * 0.25 + -1.0;
    fVar30 = 0.0;
    if (0.0 <= fVar33) {
      fVar30 = fVar33;
    }
    pDVar1 = &patch->items[3].ring.items[3].crease_weight;
    if ((0x10 < local_238[0] + 1U) &&
       ((DynamicStackArray<float,_16UL,_64UL> *)patch->items[3].ring.items[3].crease_weight.data ==
        pDVar1)) {
      pfVar14 = (float *)operator_new__(0x100);
      patch->items[3].ring.items[3].crease_weight.data = pfVar14;
      lVar19 = 0;
      do {
        patch->items[3].ring.items[3].crease_weight.data[lVar19] =
             patch->items[3].ring.items[3].crease_weight.arr[lVar19];
        lVar19 = lVar19 + 1;
      } while (lVar19 != 0x10);
    }
    patch->items[3].ring.items[3].crease_weight.data[local_238[0]] = fVar30;
    fVar33 = (fVar36 * 3.0 + fVar29) * 0.25 + -1.0;
    fVar30 = 0.0;
    if (0.0 <= fVar33) {
      fVar30 = fVar33;
    }
    pfVar14 = patch->items[3].ring.items[3].crease_weight.data;
    if ((0x10 < local_238[1] + 1U) && ((DynamicStackArray<float,_16UL,_64UL> *)pfVar14 == pDVar1)) {
      pfVar14 = (float *)operator_new__(0x100);
      patch->items[3].ring.items[3].crease_weight.data = pfVar14;
      lVar19 = 0;
      do {
        patch->items[3].ring.items[3].crease_weight.data[lVar19] =
             patch->items[3].ring.items[3].crease_weight.arr[lVar19];
        lVar19 = lVar19 + 1;
      } while (lVar19 != 0x10);
      pfVar14 = patch->items[3].ring.items[3].crease_weight.data;
    }
    pfVar14[local_238[1]] = fVar30;
    fVar29 = (fVar29 + fVar36) * 0.5;
    if (fVar29 < 1.0) {
      fVar30 = 1.0 - fVar29;
      fVar36 = fVar32 * fVar30 + fVar37 * fVar29;
      fVar34 = fVar34 * fVar30 + fVar24 * fVar29;
      fVar35 = fVar35 * fVar30 + fVar26 * fVar29;
      fVar29 = fVar31 * fVar30 + fVar27 * fVar29;
      goto LAB_00d6d944;
    }
  }
  fVar29 = (this->ring).items[0].edge_level * 0.5;
  patch->items[0].ring.items[0].edge_level = fVar29;
  patch->items[0].ring.items[1].edge_level =
       ((this->ring).items[1].edge_level + (this->ring).items[3].edge_level) * 0.25;
  patch->items[0].ring.items[2].edge_level =
       ((this->ring).items[0].edge_level + (this->ring).items[2].edge_level) * 0.25;
  patch->items[0].ring.items[3].edge_level = (this->ring).items[3].edge_level * 0.5;
  patch->items[1].ring.items[0].edge_level = (this->ring).items[0].edge_level * 0.5;
  patch->items[1].ring.items[1].edge_level = (this->ring).items[1].edge_level * 0.5;
  patch->items[1].ring.items[2].edge_level =
       ((this->ring).items[0].edge_level + (this->ring).items[2].edge_level) * 0.25;
  patch->items[1].ring.items[3].edge_level =
       ((this->ring).items[1].edge_level + (this->ring).items[3].edge_level) * 0.25;
  patch->items[2].ring.items[0].edge_level =
       ((this->ring).items[0].edge_level + (this->ring).items[2].edge_level) * 0.25;
  patch->items[2].ring.items[1].edge_level = (this->ring).items[1].edge_level * 0.5;
  patch->items[2].ring.items[2].edge_level = (this->ring).items[2].edge_level * 0.5;
  patch->items[2].ring.items[3].edge_level =
       ((this->ring).items[1].edge_level + (this->ring).items[3].edge_level) * 0.25;
  patch->items[3].ring.items[0].edge_level =
       ((this->ring).items[0].edge_level + (this->ring).items[2].edge_level) * 0.25;
  patch->items[3].ring.items[1].edge_level =
       ((this->ring).items[1].edge_level + (this->ring).items[3].edge_level) * 0.25;
  patch->items[3].ring.items[2].edge_level = (this->ring).items[2].edge_level * 0.5;
  patch->items[3].ring.items[3].edge_level = (this->ring).items[3].edge_level * 0.5;
  iVar6 = (this->ring).items[0].border_index;
  uVar17 = (this->ring).items[0].edge_valence;
  uVar21 = (this->ring).items[1].face_valence;
  patch->items[0].ring.items[1].vertex_level = fVar29;
  patch->items[1].ring.items[0].vertex_level = fVar29;
  if (((ulong)uVar17 - 2 == (long)iVar6) || (uVar21 < 3)) {
    patch->items[0].ring.items[1].edge_valence = 6;
    patch->items[1].ring.items[0].edge_valence = 6;
    patch->items[0].ring.items[1].border_index = 2;
    patch->items[0].ring.items[1].face_valence = 3;
    patch->items[1].ring.items[0].border_index = 4;
    patch->items[1].ring.items[0].face_valence = 3;
    pVVar12 = patch->items[0].ring.items[0].ring.data;
    uVar8 = *(undefined8 *)&pVVar12->field_0;
    uVar9 = *(undefined8 *)((long)&pVVar12->field_0 + 8);
    *(undefined8 *)&patch->items[0].ring.items[1].vtx.field_0 = uVar8;
    *(undefined8 *)((long)&patch->items[0].ring.items[1].vtx.field_0 + 8) = uVar9;
    *(undefined8 *)&patch->items[1].ring.items[0].vtx.field_0 = uVar8;
    *(undefined8 *)((long)&patch->items[1].ring.items[0].vtx.field_0 + 8) = uVar9;
    patch->items[0].ring.items[1].vertex_crease_weight = 0.0;
    patch->items[1].ring.items[0].vertex_crease_weight = 0.0;
    uVar8 = *(undefined8 *)&pVVar12[1].field_0;
    uVar9 = *(undefined8 *)((long)&pVVar12[1].field_0 + 8);
    pVVar12 = patch->items[0].ring.items[1].ring.data;
    *(undefined8 *)&pVVar12->field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12->field_0 + 8) = uVar9;
    pVVar12 = patch->items[1].ring.items[0].ring.data;
    *(undefined8 *)&pVVar12[2].field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12[2].field_0 + 8) = uVar9;
    pVVar12 = patch->items[1].ring.items[1].ring.data;
    uVar8 = *(undefined8 *)&pVVar12->field_0;
    uVar9 = *(undefined8 *)((long)&pVVar12->field_0 + 8);
    pVVar12 = patch->items[0].ring.items[1].ring.data;
    *(undefined8 *)&pVVar12[5].field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12[5].field_0 + 8) = uVar9;
    pVVar12 = patch->items[1].ring.items[0].ring.data;
    *(undefined8 *)&pVVar12[1].field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12[1].field_0 + 8) = uVar9;
    uVar8 = *(undefined8 *)&patch->items[1].ring.items[1].vtx.field_0;
    uVar9 = *(undefined8 *)((long)&patch->items[1].ring.items[1].vtx.field_0 + 8);
    pVVar12 = patch->items[0].ring.items[1].ring.data;
    *(undefined8 *)&pVVar12[4].field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12[4].field_0 + 8) = uVar9;
    pVVar12 = patch->items[1].ring.items[0].ring.data;
    *(undefined8 *)&pVVar12->field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12->field_0 + 8) = uVar9;
    pVVar12 = patch->items[0].ring.items[0].ring.data +
              (long)patch->items[0].ring.items[0].border_index + 1;
    uVar8 = *(undefined8 *)&pVVar12->field_0;
    uVar9 = *(undefined8 *)((long)&pVVar12->field_0 + 8);
    pVVar12 = patch->items[0].ring.items[1].ring.data;
    *(undefined8 *)&pVVar12[3].field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12[3].field_0 + 8) = uVar9;
    pVVar12 = patch->items[1].ring.items[0].ring.data;
    *(undefined8 *)&pVVar12[5].field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12[5].field_0 + 8) = uVar9;
    uVar8 = *(undefined8 *)&patch->items[0].ring.items[0].vtx.field_0;
    uVar9 = *(undefined8 *)((long)&patch->items[0].ring.items[0].vtx.field_0 + 8);
    pVVar12 = patch->items[0].ring.items[1].ring.data;
    *(undefined8 *)&pVVar12[2].field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12[2].field_0 + 8) = uVar9;
    pVVar12 = patch->items[1].ring.items[0].ring.data;
    *(undefined8 *)&pVVar12[4].field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12[4].field_0 + 8) = uVar9;
    pVVar12 = patch->items[0].ring.items[0].ring.data;
    uVar8 = *(undefined8 *)&pVVar12[2].field_0;
    uVar9 = *(undefined8 *)((long)&pVVar12[2].field_0 + 8);
    pVVar12 = patch->items[0].ring.items[1].ring.data;
    *(undefined8 *)&pVVar12[1].field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12[1].field_0 + 8) = uVar9;
    pVVar12 = patch->items[1].ring.items[0].ring.data;
    *(undefined8 *)&pVVar12[3].field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12[3].field_0 + 8) = uVar9;
    *patch->items[0].ring.items[1].crease_weight.data = 0.0;
    patch->items[1].ring.items[0].crease_weight.data[1] = 0.0;
    fVar29 = patch->items[1].ring.items[1].crease_weight.data[1];
    patch->items[0].ring.items[1].crease_weight.data[2] = fVar29;
    *patch->items[1].ring.items[0].crease_weight.data = fVar29;
    fVar29 = *patch->items[0].ring.items[0].crease_weight.data;
    patch->items[0].ring.items[1].crease_weight.data[1] = fVar29;
    patch->items[1].ring.items[0].crease_weight.data[2] = fVar29;
    uVar17 = patch->items[0].ring.items[0].eval_unique_identifier;
    uVar21 = patch->items[1].ring.items[1].eval_unique_identifier;
    if (uVar21 < uVar17) {
      patch->items[0].ring.items[1].eval_start_index = 2;
      patch->items[1].ring.items[0].eval_start_index = 0;
      goto LAB_00d6c443;
    }
    patch->items[0].ring.items[1].eval_start_index = 1;
    patch->items[1].ring.items[0].eval_start_index = 2;
LAB_00d6c481:
    patch->items[0].ring.items[1].eval_unique_identifier = uVar17;
    patch->items[1].ring.items[0].eval_unique_identifier = uVar17;
  }
  else {
    patch->items[0].ring.items[1].edge_valence = 8;
    patch->items[1].ring.items[0].edge_valence = 8;
    patch->items[0].ring.items[1].border_index = -1;
    patch->items[0].ring.items[1].face_valence = 4;
    patch->items[1].ring.items[0].border_index = -1;
    patch->items[1].ring.items[0].face_valence = 4;
    pVVar12 = patch->items[0].ring.items[0].ring.data;
    uVar8 = *(undefined8 *)&pVVar12->field_0;
    uVar9 = *(undefined8 *)((long)&pVVar12->field_0 + 8);
    *(undefined8 *)&patch->items[0].ring.items[1].vtx.field_0 = uVar8;
    *(undefined8 *)((long)&patch->items[0].ring.items[1].vtx.field_0 + 8) = uVar9;
    *(undefined8 *)&patch->items[1].ring.items[0].vtx.field_0 = uVar8;
    *(undefined8 *)((long)&patch->items[1].ring.items[0].vtx.field_0 + 8) = uVar9;
    patch->items[0].ring.items[1].vertex_crease_weight = 0.0;
    patch->items[1].ring.items[0].vertex_crease_weight = 0.0;
    uVar8 = *(undefined8 *)&pVVar12[1].field_0;
    uVar9 = *(undefined8 *)((long)&pVVar12[1].field_0 + 8);
    pVVar12 = patch->items[0].ring.items[1].ring.data;
    *(undefined8 *)&pVVar12->field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12->field_0 + 8) = uVar9;
    pVVar12 = patch->items[1].ring.items[0].ring.data;
    *(undefined8 *)&pVVar12[2].field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12[2].field_0 + 8) = uVar9;
    pVVar12 = patch->items[1].ring.items[1].ring.data;
    uVar8 = *(undefined8 *)&pVVar12->field_0;
    uVar9 = *(undefined8 *)((long)&pVVar12->field_0 + 8);
    pVVar12 = patch->items[0].ring.items[1].ring.data;
    *(undefined8 *)&pVVar12[7].field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12[7].field_0 + 8) = uVar9;
    pVVar12 = patch->items[1].ring.items[0].ring.data;
    *(undefined8 *)&pVVar12[1].field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12[1].field_0 + 8) = uVar9;
    uVar8 = *(undefined8 *)&patch->items[1].ring.items[1].vtx.field_0;
    uVar9 = *(undefined8 *)((long)&patch->items[1].ring.items[1].vtx.field_0 + 8);
    pVVar12 = patch->items[0].ring.items[1].ring.data;
    *(undefined8 *)&pVVar12[6].field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12[6].field_0 + 8) = uVar9;
    pVVar12 = patch->items[1].ring.items[0].ring.data;
    *(undefined8 *)&pVVar12->field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12->field_0 + 8) = uVar9;
    pVVar12 = patch->items[1].ring.items[1].ring.data;
    uVar8 = *(undefined8 *)&pVVar12[4].field_0;
    uVar9 = *(undefined8 *)((long)&pVVar12[4].field_0 + 8);
    pVVar12 = patch->items[0].ring.items[1].ring.data;
    *(undefined8 *)&pVVar12[5].field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12[5].field_0 + 8) = uVar9;
    pVVar12 = patch->items[1].ring.items[0].ring.data;
    *(undefined8 *)&pVVar12[7].field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12[7].field_0 + 8) = uVar9;
    pVVar12 = patch->items[0].ring.items[0].ring.data +
              (patch->items[0].ring.items[0].edge_valence - 1);
    uVar8 = *(undefined8 *)&pVVar12->field_0;
    uVar9 = *(undefined8 *)((long)&pVVar12->field_0 + 8);
    pVVar12 = patch->items[0].ring.items[1].ring.data;
    *(undefined8 *)&pVVar12[4].field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12[4].field_0 + 8) = uVar9;
    pVVar12 = patch->items[1].ring.items[0].ring.data;
    *(undefined8 *)&pVVar12[6].field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12[6].field_0 + 8) = uVar9;
    pVVar12 = patch->items[0].ring.items[0].ring.data +
              (patch->items[0].ring.items[0].edge_valence - 2);
    uVar8 = *(undefined8 *)&pVVar12->field_0;
    uVar9 = *(undefined8 *)((long)&pVVar12->field_0 + 8);
    pVVar12 = patch->items[0].ring.items[1].ring.data;
    *(undefined8 *)&pVVar12[3].field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12[3].field_0 + 8) = uVar9;
    pVVar12 = patch->items[1].ring.items[0].ring.data;
    *(undefined8 *)&pVVar12[5].field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12[5].field_0 + 8) = uVar9;
    uVar8 = *(undefined8 *)&patch->items[0].ring.items[0].vtx.field_0;
    uVar9 = *(undefined8 *)((long)&patch->items[0].ring.items[0].vtx.field_0 + 8);
    pVVar12 = patch->items[0].ring.items[1].ring.data;
    *(undefined8 *)&pVVar12[2].field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12[2].field_0 + 8) = uVar9;
    pVVar12 = patch->items[1].ring.items[0].ring.data;
    *(undefined8 *)&pVVar12[4].field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12[4].field_0 + 8) = uVar9;
    pVVar12 = patch->items[0].ring.items[0].ring.data;
    uVar8 = *(undefined8 *)&pVVar12[2].field_0;
    uVar9 = *(undefined8 *)((long)&pVVar12[2].field_0 + 8);
    pVVar12 = patch->items[0].ring.items[1].ring.data;
    *(undefined8 *)&pVVar12[1].field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12[1].field_0 + 8) = uVar9;
    pVVar12 = patch->items[1].ring.items[0].ring.data;
    *(undefined8 *)&pVVar12[3].field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12[3].field_0 + 8) = uVar9;
    *patch->items[0].ring.items[1].crease_weight.data = 0.0;
    patch->items[1].ring.items[0].crease_weight.data[1] = 0.0;
    fVar29 = patch->items[1].ring.items[1].crease_weight.data[1];
    patch->items[0].ring.items[1].crease_weight.data[3] = fVar29;
    *patch->items[1].ring.items[0].crease_weight.data = fVar29;
    patch->items[0].ring.items[1].crease_weight.data[2] = 0.0;
    patch->items[1].ring.items[0].crease_weight.data[3] = 0.0;
    fVar29 = *patch->items[0].ring.items[0].crease_weight.data;
    patch->items[0].ring.items[1].crease_weight.data[1] = fVar29;
    patch->items[1].ring.items[0].crease_weight.data[2] = fVar29;
    uVar17 = patch->items[0].ring.items[0].eval_unique_identifier;
    uVar21 = patch->items[1].ring.items[1].eval_unique_identifier;
    if (uVar17 <= uVar21) {
      patch->items[0].ring.items[1].eval_start_index = 3;
      patch->items[1].ring.items[0].eval_start_index = 0;
      goto LAB_00d6c481;
    }
    patch->items[0].ring.items[1].eval_start_index = 1;
    patch->items[1].ring.items[0].eval_start_index = 2;
LAB_00d6c443:
    patch->items[0].ring.items[1].eval_unique_identifier = uVar21;
    patch->items[1].ring.items[0].eval_unique_identifier = uVar21;
  }
  iVar6 = (this->ring).items[1].border_index;
  uVar17 = (this->ring).items[1].edge_valence;
  uVar21 = (this->ring).items[2].face_valence;
  fVar29 = patch->items[1].ring.items[1].edge_level;
  patch->items[1].ring.items[2].vertex_level = fVar29;
  patch->items[2].ring.items[1].vertex_level = fVar29;
  if (((ulong)uVar17 - 2 == (long)iVar6) || (uVar21 < 3)) {
    patch->items[1].ring.items[2].edge_valence = 6;
    patch->items[2].ring.items[1].edge_valence = 6;
    patch->items[1].ring.items[2].border_index = 2;
    patch->items[1].ring.items[2].face_valence = 3;
    patch->items[2].ring.items[1].border_index = 4;
    patch->items[2].ring.items[1].face_valence = 3;
    pVVar12 = patch->items[1].ring.items[1].ring.data;
    uVar8 = *(undefined8 *)&pVVar12->field_0;
    uVar9 = *(undefined8 *)((long)&pVVar12->field_0 + 8);
    *(undefined8 *)&patch->items[1].ring.items[2].vtx.field_0 = uVar8;
    *(undefined8 *)((long)&patch->items[1].ring.items[2].vtx.field_0 + 8) = uVar9;
    *(undefined8 *)&patch->items[2].ring.items[1].vtx.field_0 = uVar8;
    *(undefined8 *)((long)&patch->items[2].ring.items[1].vtx.field_0 + 8) = uVar9;
    patch->items[1].ring.items[2].vertex_crease_weight = 0.0;
    patch->items[2].ring.items[1].vertex_crease_weight = 0.0;
    uVar8 = *(undefined8 *)&pVVar12[1].field_0;
    uVar9 = *(undefined8 *)((long)&pVVar12[1].field_0 + 8);
    pVVar12 = patch->items[1].ring.items[2].ring.data;
    *(undefined8 *)&pVVar12->field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12->field_0 + 8) = uVar9;
    pVVar12 = patch->items[2].ring.items[1].ring.data;
    *(undefined8 *)&pVVar12[2].field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12[2].field_0 + 8) = uVar9;
    pVVar12 = patch->items[2].ring.items[2].ring.data;
    uVar8 = *(undefined8 *)&pVVar12->field_0;
    uVar9 = *(undefined8 *)((long)&pVVar12->field_0 + 8);
    pVVar12 = patch->items[1].ring.items[2].ring.data;
    *(undefined8 *)&pVVar12[5].field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12[5].field_0 + 8) = uVar9;
    pVVar12 = patch->items[2].ring.items[1].ring.data;
    *(undefined8 *)&pVVar12[1].field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12[1].field_0 + 8) = uVar9;
    uVar8 = *(undefined8 *)&patch->items[2].ring.items[2].vtx.field_0;
    uVar9 = *(undefined8 *)((long)&patch->items[2].ring.items[2].vtx.field_0 + 8);
    pVVar12 = patch->items[1].ring.items[2].ring.data;
    *(undefined8 *)&pVVar12[4].field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12[4].field_0 + 8) = uVar9;
    pVVar12 = patch->items[2].ring.items[1].ring.data;
    *(undefined8 *)&pVVar12->field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12->field_0 + 8) = uVar9;
    pVVar12 = patch->items[1].ring.items[1].ring.data +
              (long)patch->items[1].ring.items[1].border_index + 1;
    uVar8 = *(undefined8 *)&pVVar12->field_0;
    uVar9 = *(undefined8 *)((long)&pVVar12->field_0 + 8);
    pVVar12 = patch->items[1].ring.items[2].ring.data;
    *(undefined8 *)&pVVar12[3].field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12[3].field_0 + 8) = uVar9;
    pVVar12 = patch->items[2].ring.items[1].ring.data;
    *(undefined8 *)&pVVar12[5].field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12[5].field_0 + 8) = uVar9;
    uVar8 = *(undefined8 *)&patch->items[1].ring.items[1].vtx.field_0;
    uVar9 = *(undefined8 *)((long)&patch->items[1].ring.items[1].vtx.field_0 + 8);
    pVVar12 = patch->items[1].ring.items[2].ring.data;
    *(undefined8 *)&pVVar12[2].field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12[2].field_0 + 8) = uVar9;
    pVVar12 = patch->items[2].ring.items[1].ring.data;
    *(undefined8 *)&pVVar12[4].field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12[4].field_0 + 8) = uVar9;
    pVVar12 = patch->items[1].ring.items[1].ring.data;
    uVar8 = *(undefined8 *)&pVVar12[2].field_0;
    uVar9 = *(undefined8 *)((long)&pVVar12[2].field_0 + 8);
    pVVar12 = patch->items[1].ring.items[2].ring.data;
    *(undefined8 *)&pVVar12[1].field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12[1].field_0 + 8) = uVar9;
    pVVar12 = patch->items[2].ring.items[1].ring.data;
    *(undefined8 *)&pVVar12[3].field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12[3].field_0 + 8) = uVar9;
    *patch->items[1].ring.items[2].crease_weight.data = 0.0;
    patch->items[2].ring.items[1].crease_weight.data[1] = 0.0;
    fVar29 = patch->items[2].ring.items[2].crease_weight.data[1];
    patch->items[1].ring.items[2].crease_weight.data[2] = fVar29;
    *patch->items[2].ring.items[1].crease_weight.data = fVar29;
    fVar29 = *patch->items[1].ring.items[1].crease_weight.data;
    patch->items[1].ring.items[2].crease_weight.data[1] = fVar29;
    patch->items[2].ring.items[1].crease_weight.data[2] = fVar29;
    uVar17 = patch->items[1].ring.items[1].eval_unique_identifier;
    uVar21 = patch->items[2].ring.items[2].eval_unique_identifier;
    if (uVar21 < uVar17) {
      patch->items[1].ring.items[2].eval_start_index = 2;
      patch->items[2].ring.items[1].eval_start_index = 0;
      goto LAB_00d6c869;
    }
    patch->items[1].ring.items[2].eval_start_index = 1;
    patch->items[2].ring.items[1].eval_start_index = 2;
LAB_00d6c8a7:
    patch->items[1].ring.items[2].eval_unique_identifier = uVar17;
    patch->items[2].ring.items[1].eval_unique_identifier = uVar17;
  }
  else {
    patch->items[1].ring.items[2].edge_valence = 8;
    patch->items[2].ring.items[1].edge_valence = 8;
    patch->items[1].ring.items[2].border_index = -1;
    patch->items[1].ring.items[2].face_valence = 4;
    patch->items[2].ring.items[1].border_index = -1;
    patch->items[2].ring.items[1].face_valence = 4;
    pVVar12 = patch->items[1].ring.items[1].ring.data;
    uVar8 = *(undefined8 *)&pVVar12->field_0;
    uVar9 = *(undefined8 *)((long)&pVVar12->field_0 + 8);
    *(undefined8 *)&patch->items[1].ring.items[2].vtx.field_0 = uVar8;
    *(undefined8 *)((long)&patch->items[1].ring.items[2].vtx.field_0 + 8) = uVar9;
    *(undefined8 *)&patch->items[2].ring.items[1].vtx.field_0 = uVar8;
    *(undefined8 *)((long)&patch->items[2].ring.items[1].vtx.field_0 + 8) = uVar9;
    patch->items[1].ring.items[2].vertex_crease_weight = 0.0;
    patch->items[2].ring.items[1].vertex_crease_weight = 0.0;
    uVar8 = *(undefined8 *)&pVVar12[1].field_0;
    uVar9 = *(undefined8 *)((long)&pVVar12[1].field_0 + 8);
    pVVar12 = patch->items[1].ring.items[2].ring.data;
    *(undefined8 *)&pVVar12->field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12->field_0 + 8) = uVar9;
    pVVar12 = patch->items[2].ring.items[1].ring.data;
    *(undefined8 *)&pVVar12[2].field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12[2].field_0 + 8) = uVar9;
    pVVar12 = patch->items[2].ring.items[2].ring.data;
    uVar8 = *(undefined8 *)&pVVar12->field_0;
    uVar9 = *(undefined8 *)((long)&pVVar12->field_0 + 8);
    pVVar12 = patch->items[1].ring.items[2].ring.data;
    *(undefined8 *)&pVVar12[7].field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12[7].field_0 + 8) = uVar9;
    pVVar12 = patch->items[2].ring.items[1].ring.data;
    *(undefined8 *)&pVVar12[1].field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12[1].field_0 + 8) = uVar9;
    uVar8 = *(undefined8 *)&patch->items[2].ring.items[2].vtx.field_0;
    uVar9 = *(undefined8 *)((long)&patch->items[2].ring.items[2].vtx.field_0 + 8);
    pVVar12 = patch->items[1].ring.items[2].ring.data;
    *(undefined8 *)&pVVar12[6].field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12[6].field_0 + 8) = uVar9;
    pVVar12 = patch->items[2].ring.items[1].ring.data;
    *(undefined8 *)&pVVar12->field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12->field_0 + 8) = uVar9;
    pVVar12 = patch->items[2].ring.items[2].ring.data;
    uVar8 = *(undefined8 *)&pVVar12[4].field_0;
    uVar9 = *(undefined8 *)((long)&pVVar12[4].field_0 + 8);
    pVVar12 = patch->items[1].ring.items[2].ring.data;
    *(undefined8 *)&pVVar12[5].field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12[5].field_0 + 8) = uVar9;
    pVVar12 = patch->items[2].ring.items[1].ring.data;
    *(undefined8 *)&pVVar12[7].field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12[7].field_0 + 8) = uVar9;
    pVVar12 = patch->items[1].ring.items[1].ring.data +
              (patch->items[1].ring.items[1].edge_valence - 1);
    uVar8 = *(undefined8 *)&pVVar12->field_0;
    uVar9 = *(undefined8 *)((long)&pVVar12->field_0 + 8);
    pVVar12 = patch->items[1].ring.items[2].ring.data;
    *(undefined8 *)&pVVar12[4].field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12[4].field_0 + 8) = uVar9;
    pVVar12 = patch->items[2].ring.items[1].ring.data;
    *(undefined8 *)&pVVar12[6].field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12[6].field_0 + 8) = uVar9;
    pVVar12 = patch->items[1].ring.items[1].ring.data +
              (patch->items[1].ring.items[1].edge_valence - 2);
    uVar8 = *(undefined8 *)&pVVar12->field_0;
    uVar9 = *(undefined8 *)((long)&pVVar12->field_0 + 8);
    pVVar12 = patch->items[1].ring.items[2].ring.data;
    *(undefined8 *)&pVVar12[3].field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12[3].field_0 + 8) = uVar9;
    pVVar12 = patch->items[2].ring.items[1].ring.data;
    *(undefined8 *)&pVVar12[5].field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12[5].field_0 + 8) = uVar9;
    uVar8 = *(undefined8 *)&patch->items[1].ring.items[1].vtx.field_0;
    uVar9 = *(undefined8 *)((long)&patch->items[1].ring.items[1].vtx.field_0 + 8);
    pVVar12 = patch->items[1].ring.items[2].ring.data;
    *(undefined8 *)&pVVar12[2].field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12[2].field_0 + 8) = uVar9;
    pVVar12 = patch->items[2].ring.items[1].ring.data;
    *(undefined8 *)&pVVar12[4].field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12[4].field_0 + 8) = uVar9;
    pVVar12 = patch->items[1].ring.items[1].ring.data;
    uVar8 = *(undefined8 *)&pVVar12[2].field_0;
    uVar9 = *(undefined8 *)((long)&pVVar12[2].field_0 + 8);
    pVVar12 = patch->items[1].ring.items[2].ring.data;
    *(undefined8 *)&pVVar12[1].field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12[1].field_0 + 8) = uVar9;
    pVVar12 = patch->items[2].ring.items[1].ring.data;
    *(undefined8 *)&pVVar12[3].field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12[3].field_0 + 8) = uVar9;
    *patch->items[1].ring.items[2].crease_weight.data = 0.0;
    patch->items[2].ring.items[1].crease_weight.data[1] = 0.0;
    fVar29 = patch->items[2].ring.items[2].crease_weight.data[1];
    patch->items[1].ring.items[2].crease_weight.data[3] = fVar29;
    *patch->items[2].ring.items[1].crease_weight.data = fVar29;
    patch->items[1].ring.items[2].crease_weight.data[2] = 0.0;
    patch->items[2].ring.items[1].crease_weight.data[3] = 0.0;
    fVar29 = *patch->items[1].ring.items[1].crease_weight.data;
    patch->items[1].ring.items[2].crease_weight.data[1] = fVar29;
    patch->items[2].ring.items[1].crease_weight.data[2] = fVar29;
    uVar17 = patch->items[1].ring.items[1].eval_unique_identifier;
    uVar21 = patch->items[2].ring.items[2].eval_unique_identifier;
    if (uVar17 <= uVar21) {
      patch->items[1].ring.items[2].eval_start_index = 3;
      patch->items[2].ring.items[1].eval_start_index = 0;
      goto LAB_00d6c8a7;
    }
    patch->items[1].ring.items[2].eval_start_index = 1;
    patch->items[2].ring.items[1].eval_start_index = 2;
LAB_00d6c869:
    patch->items[1].ring.items[2].eval_unique_identifier = uVar21;
    patch->items[2].ring.items[1].eval_unique_identifier = uVar21;
  }
  iVar6 = (this->ring).items[2].border_index;
  uVar17 = (this->ring).items[2].edge_valence;
  uVar21 = (this->ring).items[3].face_valence;
  fVar29 = patch->items[2].ring.items[2].edge_level;
  patch->items[2].ring.items[3].vertex_level = fVar29;
  patch->items[3].ring.items[2].vertex_level = fVar29;
  if (((ulong)uVar17 - 2 == (long)iVar6) || (uVar21 < 3)) {
    patch->items[2].ring.items[3].edge_valence = 6;
    patch->items[3].ring.items[2].edge_valence = 6;
    patch->items[2].ring.items[3].border_index = 2;
    patch->items[2].ring.items[3].face_valence = 3;
    patch->items[3].ring.items[2].border_index = 4;
    patch->items[3].ring.items[2].face_valence = 3;
    pVVar12 = patch->items[2].ring.items[2].ring.data;
    uVar8 = *(undefined8 *)&pVVar12->field_0;
    uVar9 = *(undefined8 *)((long)&pVVar12->field_0 + 8);
    *(undefined8 *)&patch->items[2].ring.items[3].vtx.field_0 = uVar8;
    *(undefined8 *)((long)&patch->items[2].ring.items[3].vtx.field_0 + 8) = uVar9;
    *(undefined8 *)&patch->items[3].ring.items[2].vtx.field_0 = uVar8;
    *(undefined8 *)((long)&patch->items[3].ring.items[2].vtx.field_0 + 8) = uVar9;
    patch->items[2].ring.items[3].vertex_crease_weight = 0.0;
    patch->items[3].ring.items[2].vertex_crease_weight = 0.0;
    uVar8 = *(undefined8 *)&pVVar12[1].field_0;
    uVar9 = *(undefined8 *)((long)&pVVar12[1].field_0 + 8);
    pVVar12 = patch->items[2].ring.items[3].ring.data;
    *(undefined8 *)&pVVar12->field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12->field_0 + 8) = uVar9;
    pVVar12 = patch->items[3].ring.items[2].ring.data;
    *(undefined8 *)&pVVar12[2].field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12[2].field_0 + 8) = uVar9;
    pVVar12 = patch->items[3].ring.items[3].ring.data;
    uVar8 = *(undefined8 *)&pVVar12->field_0;
    uVar9 = *(undefined8 *)((long)&pVVar12->field_0 + 8);
    pVVar12 = patch->items[2].ring.items[3].ring.data;
    *(undefined8 *)&pVVar12[5].field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12[5].field_0 + 8) = uVar9;
    pVVar12 = patch->items[3].ring.items[2].ring.data;
    *(undefined8 *)&pVVar12[1].field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12[1].field_0 + 8) = uVar9;
    uVar8 = *(undefined8 *)&patch->items[3].ring.items[3].vtx.field_0;
    uVar9 = *(undefined8 *)((long)&patch->items[3].ring.items[3].vtx.field_0 + 8);
    pVVar12 = patch->items[2].ring.items[3].ring.data;
    *(undefined8 *)&pVVar12[4].field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12[4].field_0 + 8) = uVar9;
    pVVar12 = patch->items[3].ring.items[2].ring.data;
    *(undefined8 *)&pVVar12->field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12->field_0 + 8) = uVar9;
    pVVar12 = patch->items[2].ring.items[2].ring.data +
              (long)patch->items[2].ring.items[2].border_index + 1;
    uVar8 = *(undefined8 *)&pVVar12->field_0;
    uVar9 = *(undefined8 *)((long)&pVVar12->field_0 + 8);
    pVVar12 = patch->items[2].ring.items[3].ring.data;
    *(undefined8 *)&pVVar12[3].field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12[3].field_0 + 8) = uVar9;
    pVVar12 = patch->items[3].ring.items[2].ring.data;
    *(undefined8 *)&pVVar12[5].field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12[5].field_0 + 8) = uVar9;
    uVar8 = *(undefined8 *)&patch->items[2].ring.items[2].vtx.field_0;
    uVar9 = *(undefined8 *)((long)&patch->items[2].ring.items[2].vtx.field_0 + 8);
    pVVar12 = patch->items[2].ring.items[3].ring.data;
    *(undefined8 *)&pVVar12[2].field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12[2].field_0 + 8) = uVar9;
    pVVar12 = patch->items[3].ring.items[2].ring.data;
    *(undefined8 *)&pVVar12[4].field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12[4].field_0 + 8) = uVar9;
    pVVar12 = patch->items[2].ring.items[2].ring.data;
    uVar8 = *(undefined8 *)&pVVar12[2].field_0;
    uVar9 = *(undefined8 *)((long)&pVVar12[2].field_0 + 8);
    pVVar12 = patch->items[2].ring.items[3].ring.data;
    *(undefined8 *)&pVVar12[1].field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12[1].field_0 + 8) = uVar9;
    pVVar12 = patch->items[3].ring.items[2].ring.data;
    *(undefined8 *)&pVVar12[3].field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12[3].field_0 + 8) = uVar9;
    *patch->items[2].ring.items[3].crease_weight.data = 0.0;
    patch->items[3].ring.items[2].crease_weight.data[1] = 0.0;
    fVar29 = patch->items[3].ring.items[3].crease_weight.data[1];
    patch->items[2].ring.items[3].crease_weight.data[2] = fVar29;
    *patch->items[3].ring.items[2].crease_weight.data = fVar29;
    fVar29 = *patch->items[2].ring.items[2].crease_weight.data;
    patch->items[2].ring.items[3].crease_weight.data[1] = fVar29;
    patch->items[3].ring.items[2].crease_weight.data[2] = fVar29;
    uVar17 = patch->items[2].ring.items[2].eval_unique_identifier;
    uVar21 = patch->items[3].ring.items[3].eval_unique_identifier;
    if (uVar21 < uVar17) {
      patch->items[2].ring.items[3].eval_start_index = 2;
      patch->items[3].ring.items[2].eval_start_index = 0;
      goto LAB_00d6cc8f;
    }
    patch->items[2].ring.items[3].eval_start_index = 1;
    patch->items[3].ring.items[2].eval_start_index = 2;
LAB_00d6cccd:
    patch->items[2].ring.items[3].eval_unique_identifier = uVar17;
    patch->items[3].ring.items[2].eval_unique_identifier = uVar17;
  }
  else {
    patch->items[2].ring.items[3].edge_valence = 8;
    patch->items[3].ring.items[2].edge_valence = 8;
    patch->items[2].ring.items[3].border_index = -1;
    patch->items[2].ring.items[3].face_valence = 4;
    patch->items[3].ring.items[2].border_index = -1;
    patch->items[3].ring.items[2].face_valence = 4;
    pVVar12 = patch->items[2].ring.items[2].ring.data;
    uVar8 = *(undefined8 *)&pVVar12->field_0;
    uVar9 = *(undefined8 *)((long)&pVVar12->field_0 + 8);
    *(undefined8 *)&patch->items[2].ring.items[3].vtx.field_0 = uVar8;
    *(undefined8 *)((long)&patch->items[2].ring.items[3].vtx.field_0 + 8) = uVar9;
    *(undefined8 *)&patch->items[3].ring.items[2].vtx.field_0 = uVar8;
    *(undefined8 *)((long)&patch->items[3].ring.items[2].vtx.field_0 + 8) = uVar9;
    patch->items[2].ring.items[3].vertex_crease_weight = 0.0;
    patch->items[3].ring.items[2].vertex_crease_weight = 0.0;
    uVar8 = *(undefined8 *)&pVVar12[1].field_0;
    uVar9 = *(undefined8 *)((long)&pVVar12[1].field_0 + 8);
    pVVar12 = patch->items[2].ring.items[3].ring.data;
    *(undefined8 *)&pVVar12->field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12->field_0 + 8) = uVar9;
    pVVar12 = patch->items[3].ring.items[2].ring.data;
    *(undefined8 *)&pVVar12[2].field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12[2].field_0 + 8) = uVar9;
    pVVar12 = patch->items[3].ring.items[3].ring.data;
    uVar8 = *(undefined8 *)&pVVar12->field_0;
    uVar9 = *(undefined8 *)((long)&pVVar12->field_0 + 8);
    pVVar12 = patch->items[2].ring.items[3].ring.data;
    *(undefined8 *)&pVVar12[7].field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12[7].field_0 + 8) = uVar9;
    pVVar12 = patch->items[3].ring.items[2].ring.data;
    *(undefined8 *)&pVVar12[1].field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12[1].field_0 + 8) = uVar9;
    uVar8 = *(undefined8 *)&patch->items[3].ring.items[3].vtx.field_0;
    uVar9 = *(undefined8 *)((long)&patch->items[3].ring.items[3].vtx.field_0 + 8);
    pVVar12 = patch->items[2].ring.items[3].ring.data;
    *(undefined8 *)&pVVar12[6].field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12[6].field_0 + 8) = uVar9;
    pVVar12 = patch->items[3].ring.items[2].ring.data;
    *(undefined8 *)&pVVar12->field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12->field_0 + 8) = uVar9;
    pVVar12 = patch->items[3].ring.items[3].ring.data;
    uVar8 = *(undefined8 *)&pVVar12[4].field_0;
    uVar9 = *(undefined8 *)((long)&pVVar12[4].field_0 + 8);
    pVVar12 = patch->items[2].ring.items[3].ring.data;
    *(undefined8 *)&pVVar12[5].field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12[5].field_0 + 8) = uVar9;
    pVVar12 = patch->items[3].ring.items[2].ring.data;
    *(undefined8 *)&pVVar12[7].field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12[7].field_0 + 8) = uVar9;
    pVVar12 = patch->items[2].ring.items[2].ring.data +
              (patch->items[2].ring.items[2].edge_valence - 1);
    uVar8 = *(undefined8 *)&pVVar12->field_0;
    uVar9 = *(undefined8 *)((long)&pVVar12->field_0 + 8);
    pVVar12 = patch->items[2].ring.items[3].ring.data;
    *(undefined8 *)&pVVar12[4].field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12[4].field_0 + 8) = uVar9;
    pVVar12 = patch->items[3].ring.items[2].ring.data;
    *(undefined8 *)&pVVar12[6].field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12[6].field_0 + 8) = uVar9;
    pVVar12 = patch->items[2].ring.items[2].ring.data +
              (patch->items[2].ring.items[2].edge_valence - 2);
    uVar8 = *(undefined8 *)&pVVar12->field_0;
    uVar9 = *(undefined8 *)((long)&pVVar12->field_0 + 8);
    pVVar12 = patch->items[2].ring.items[3].ring.data;
    *(undefined8 *)&pVVar12[3].field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12[3].field_0 + 8) = uVar9;
    pVVar12 = patch->items[3].ring.items[2].ring.data;
    *(undefined8 *)&pVVar12[5].field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12[5].field_0 + 8) = uVar9;
    uVar8 = *(undefined8 *)&patch->items[2].ring.items[2].vtx.field_0;
    uVar9 = *(undefined8 *)((long)&patch->items[2].ring.items[2].vtx.field_0 + 8);
    pVVar12 = patch->items[2].ring.items[3].ring.data;
    *(undefined8 *)&pVVar12[2].field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12[2].field_0 + 8) = uVar9;
    pVVar12 = patch->items[3].ring.items[2].ring.data;
    *(undefined8 *)&pVVar12[4].field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12[4].field_0 + 8) = uVar9;
    pVVar12 = patch->items[2].ring.items[2].ring.data;
    uVar8 = *(undefined8 *)&pVVar12[2].field_0;
    uVar9 = *(undefined8 *)((long)&pVVar12[2].field_0 + 8);
    pVVar12 = patch->items[2].ring.items[3].ring.data;
    *(undefined8 *)&pVVar12[1].field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12[1].field_0 + 8) = uVar9;
    pVVar12 = patch->items[3].ring.items[2].ring.data;
    *(undefined8 *)&pVVar12[3].field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12[3].field_0 + 8) = uVar9;
    *patch->items[2].ring.items[3].crease_weight.data = 0.0;
    patch->items[3].ring.items[2].crease_weight.data[1] = 0.0;
    fVar29 = patch->items[3].ring.items[3].crease_weight.data[1];
    patch->items[2].ring.items[3].crease_weight.data[3] = fVar29;
    *patch->items[3].ring.items[2].crease_weight.data = fVar29;
    patch->items[2].ring.items[3].crease_weight.data[2] = 0.0;
    patch->items[3].ring.items[2].crease_weight.data[3] = 0.0;
    fVar29 = *patch->items[2].ring.items[2].crease_weight.data;
    patch->items[2].ring.items[3].crease_weight.data[1] = fVar29;
    patch->items[3].ring.items[2].crease_weight.data[2] = fVar29;
    uVar17 = patch->items[2].ring.items[2].eval_unique_identifier;
    uVar21 = patch->items[3].ring.items[3].eval_unique_identifier;
    if (uVar17 <= uVar21) {
      patch->items[2].ring.items[3].eval_start_index = 3;
      patch->items[3].ring.items[2].eval_start_index = 0;
      goto LAB_00d6cccd;
    }
    patch->items[2].ring.items[3].eval_start_index = 1;
    patch->items[3].ring.items[2].eval_start_index = 2;
LAB_00d6cc8f:
    patch->items[2].ring.items[3].eval_unique_identifier = uVar21;
    patch->items[3].ring.items[2].eval_unique_identifier = uVar21;
  }
  iVar6 = (this->ring).items[3].border_index;
  uVar17 = (this->ring).items[3].edge_valence;
  uVar21 = (this->ring).items[0].face_valence;
  fVar29 = patch->items[3].ring.items[3].edge_level;
  patch->items[3].ring.items[0].vertex_level = fVar29;
  patch->items[0].ring.items[3].vertex_level = fVar29;
  if (((ulong)uVar17 - 2 == (long)iVar6) || (uVar21 < 3)) {
    patch->items[3].ring.items[0].edge_valence = 6;
    patch->items[0].ring.items[3].edge_valence = 6;
    patch->items[3].ring.items[0].border_index = 2;
    patch->items[3].ring.items[0].face_valence = 3;
    patch->items[0].ring.items[3].border_index = 4;
    patch->items[0].ring.items[3].face_valence = 3;
    pVVar12 = patch->items[3].ring.items[3].ring.data;
    uVar8 = *(undefined8 *)&pVVar12->field_0;
    uVar9 = *(undefined8 *)((long)&pVVar12->field_0 + 8);
    *(undefined8 *)&patch->items[3].ring.items[0].vtx.field_0 = uVar8;
    *(undefined8 *)((long)&patch->items[3].ring.items[0].vtx.field_0 + 8) = uVar9;
    *(undefined8 *)&patch->items[0].ring.items[3].vtx.field_0 = uVar8;
    *(undefined8 *)((long)&patch->items[0].ring.items[3].vtx.field_0 + 8) = uVar9;
    patch->items[3].ring.items[0].vertex_crease_weight = 0.0;
    patch->items[0].ring.items[3].vertex_crease_weight = 0.0;
    uVar8 = *(undefined8 *)&pVVar12[1].field_0;
    uVar9 = *(undefined8 *)((long)&pVVar12[1].field_0 + 8);
    pVVar12 = patch->items[3].ring.items[0].ring.data;
    *(undefined8 *)&pVVar12->field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12->field_0 + 8) = uVar9;
    pVVar12 = patch->items[0].ring.items[3].ring.data;
    *(undefined8 *)&pVVar12[2].field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12[2].field_0 + 8) = uVar9;
    pVVar12 = patch->items[0].ring.items[0].ring.data;
    uVar8 = *(undefined8 *)&pVVar12->field_0;
    uVar9 = *(undefined8 *)((long)&pVVar12->field_0 + 8);
    pVVar12 = patch->items[3].ring.items[0].ring.data;
    *(undefined8 *)&pVVar12[5].field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12[5].field_0 + 8) = uVar9;
    pVVar12 = patch->items[0].ring.items[3].ring.data;
    *(undefined8 *)&pVVar12[1].field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12[1].field_0 + 8) = uVar9;
    uVar8 = *(undefined8 *)&patch->items[0].ring.items[0].vtx.field_0;
    uVar9 = *(undefined8 *)((long)&patch->items[0].ring.items[0].vtx.field_0 + 8);
    pVVar12 = patch->items[3].ring.items[0].ring.data;
    *(undefined8 *)&pVVar12[4].field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12[4].field_0 + 8) = uVar9;
    pVVar12 = patch->items[0].ring.items[3].ring.data;
    *(undefined8 *)&pVVar12->field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12->field_0 + 8) = uVar9;
    pVVar12 = patch->items[3].ring.items[3].ring.data +
              (long)patch->items[3].ring.items[3].border_index + 1;
    uVar8 = *(undefined8 *)&pVVar12->field_0;
    uVar9 = *(undefined8 *)((long)&pVVar12->field_0 + 8);
    pVVar12 = patch->items[3].ring.items[0].ring.data;
    *(undefined8 *)&pVVar12[3].field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12[3].field_0 + 8) = uVar9;
    pVVar12 = patch->items[0].ring.items[3].ring.data;
    *(undefined8 *)&pVVar12[5].field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12[5].field_0 + 8) = uVar9;
    uVar8 = *(undefined8 *)&patch->items[3].ring.items[3].vtx.field_0;
    uVar9 = *(undefined8 *)((long)&patch->items[3].ring.items[3].vtx.field_0 + 8);
    pVVar12 = patch->items[3].ring.items[0].ring.data;
    *(undefined8 *)&pVVar12[2].field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12[2].field_0 + 8) = uVar9;
    pVVar12 = patch->items[0].ring.items[3].ring.data;
    *(undefined8 *)&pVVar12[4].field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12[4].field_0 + 8) = uVar9;
    pVVar12 = patch->items[3].ring.items[3].ring.data;
    uVar8 = *(undefined8 *)&pVVar12[2].field_0;
    uVar9 = *(undefined8 *)((long)&pVVar12[2].field_0 + 8);
    pVVar12 = patch->items[3].ring.items[0].ring.data;
    *(undefined8 *)&pVVar12[1].field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12[1].field_0 + 8) = uVar9;
    pVVar12 = patch->items[0].ring.items[3].ring.data;
    *(undefined8 *)&pVVar12[3].field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12[3].field_0 + 8) = uVar9;
    *patch->items[3].ring.items[0].crease_weight.data = 0.0;
    patch->items[0].ring.items[3].crease_weight.data[1] = 0.0;
    fVar29 = patch->items[0].ring.items[0].crease_weight.data[1];
    patch->items[3].ring.items[0].crease_weight.data[2] = fVar29;
    *patch->items[0].ring.items[3].crease_weight.data = fVar29;
    fVar29 = *patch->items[3].ring.items[3].crease_weight.data;
    patch->items[3].ring.items[0].crease_weight.data[1] = fVar29;
    patch->items[0].ring.items[3].crease_weight.data[2] = fVar29;
    uVar17 = patch->items[3].ring.items[3].eval_unique_identifier;
    uVar21 = patch->items[0].ring.items[0].eval_unique_identifier;
    if (uVar17 <= uVar21) {
      patch->items[3].ring.items[0].eval_start_index = 1;
      patch->items[0].ring.items[3].eval_start_index = 2;
      goto LAB_00d6d0f0;
    }
    patch->items[3].ring.items[0].eval_start_index = 2;
    patch->items[0].ring.items[3].eval_start_index = 0;
  }
  else {
    patch->items[3].ring.items[0].edge_valence = 8;
    patch->items[0].ring.items[3].edge_valence = 8;
    patch->items[3].ring.items[0].border_index = -1;
    patch->items[3].ring.items[0].face_valence = 4;
    patch->items[0].ring.items[3].border_index = -1;
    patch->items[0].ring.items[3].face_valence = 4;
    pVVar12 = patch->items[3].ring.items[3].ring.data;
    uVar8 = *(undefined8 *)&pVVar12->field_0;
    uVar9 = *(undefined8 *)((long)&pVVar12->field_0 + 8);
    *(undefined8 *)&patch->items[3].ring.items[0].vtx.field_0 = uVar8;
    *(undefined8 *)((long)&patch->items[3].ring.items[0].vtx.field_0 + 8) = uVar9;
    *(undefined8 *)&patch->items[0].ring.items[3].vtx.field_0 = uVar8;
    *(undefined8 *)((long)&patch->items[0].ring.items[3].vtx.field_0 + 8) = uVar9;
    patch->items[3].ring.items[0].vertex_crease_weight = 0.0;
    patch->items[0].ring.items[3].vertex_crease_weight = 0.0;
    uVar8 = *(undefined8 *)&pVVar12[1].field_0;
    uVar9 = *(undefined8 *)((long)&pVVar12[1].field_0 + 8);
    pVVar12 = patch->items[3].ring.items[0].ring.data;
    *(undefined8 *)&pVVar12->field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12->field_0 + 8) = uVar9;
    pVVar12 = patch->items[0].ring.items[3].ring.data;
    *(undefined8 *)&pVVar12[2].field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12[2].field_0 + 8) = uVar9;
    pVVar12 = patch->items[0].ring.items[0].ring.data;
    uVar8 = *(undefined8 *)&pVVar12->field_0;
    uVar9 = *(undefined8 *)((long)&pVVar12->field_0 + 8);
    pVVar12 = patch->items[3].ring.items[0].ring.data;
    *(undefined8 *)&pVVar12[7].field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12[7].field_0 + 8) = uVar9;
    pVVar12 = patch->items[0].ring.items[3].ring.data;
    *(undefined8 *)&pVVar12[1].field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12[1].field_0 + 8) = uVar9;
    uVar8 = *(undefined8 *)&patch->items[0].ring.items[0].vtx.field_0;
    uVar9 = *(undefined8 *)((long)&patch->items[0].ring.items[0].vtx.field_0 + 8);
    pVVar12 = patch->items[3].ring.items[0].ring.data;
    *(undefined8 *)&pVVar12[6].field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12[6].field_0 + 8) = uVar9;
    pVVar12 = patch->items[0].ring.items[3].ring.data;
    *(undefined8 *)&pVVar12->field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12->field_0 + 8) = uVar9;
    pVVar12 = patch->items[0].ring.items[0].ring.data;
    uVar8 = *(undefined8 *)&pVVar12[4].field_0;
    uVar9 = *(undefined8 *)((long)&pVVar12[4].field_0 + 8);
    pVVar12 = patch->items[3].ring.items[0].ring.data;
    *(undefined8 *)&pVVar12[5].field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12[5].field_0 + 8) = uVar9;
    pVVar12 = patch->items[0].ring.items[3].ring.data;
    *(undefined8 *)&pVVar12[7].field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12[7].field_0 + 8) = uVar9;
    pVVar12 = patch->items[3].ring.items[3].ring.data +
              (patch->items[3].ring.items[3].edge_valence - 1);
    uVar8 = *(undefined8 *)&pVVar12->field_0;
    uVar9 = *(undefined8 *)((long)&pVVar12->field_0 + 8);
    pVVar12 = patch->items[3].ring.items[0].ring.data;
    *(undefined8 *)&pVVar12[4].field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12[4].field_0 + 8) = uVar9;
    pVVar12 = patch->items[0].ring.items[3].ring.data;
    *(undefined8 *)&pVVar12[6].field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12[6].field_0 + 8) = uVar9;
    pVVar12 = patch->items[3].ring.items[3].ring.data +
              (patch->items[3].ring.items[3].edge_valence - 2);
    uVar8 = *(undefined8 *)&pVVar12->field_0;
    uVar9 = *(undefined8 *)((long)&pVVar12->field_0 + 8);
    pVVar12 = patch->items[3].ring.items[0].ring.data;
    *(undefined8 *)&pVVar12[3].field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12[3].field_0 + 8) = uVar9;
    pVVar12 = patch->items[0].ring.items[3].ring.data;
    *(undefined8 *)&pVVar12[5].field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12[5].field_0 + 8) = uVar9;
    uVar8 = *(undefined8 *)&patch->items[3].ring.items[3].vtx.field_0;
    uVar9 = *(undefined8 *)((long)&patch->items[3].ring.items[3].vtx.field_0 + 8);
    pVVar12 = patch->items[3].ring.items[0].ring.data;
    *(undefined8 *)&pVVar12[2].field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12[2].field_0 + 8) = uVar9;
    pVVar12 = patch->items[0].ring.items[3].ring.data;
    *(undefined8 *)&pVVar12[4].field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12[4].field_0 + 8) = uVar9;
    pVVar12 = patch->items[3].ring.items[3].ring.data;
    uVar8 = *(undefined8 *)&pVVar12[2].field_0;
    uVar9 = *(undefined8 *)((long)&pVVar12[2].field_0 + 8);
    pVVar12 = patch->items[3].ring.items[0].ring.data;
    *(undefined8 *)&pVVar12[1].field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12[1].field_0 + 8) = uVar9;
    pVVar12 = patch->items[0].ring.items[3].ring.data;
    *(undefined8 *)&pVVar12[3].field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12[3].field_0 + 8) = uVar9;
    *patch->items[3].ring.items[0].crease_weight.data = 0.0;
    patch->items[0].ring.items[3].crease_weight.data[1] = 0.0;
    fVar29 = patch->items[0].ring.items[0].crease_weight.data[1];
    patch->items[3].ring.items[0].crease_weight.data[3] = fVar29;
    *patch->items[0].ring.items[3].crease_weight.data = fVar29;
    patch->items[3].ring.items[0].crease_weight.data[2] = 0.0;
    patch->items[0].ring.items[3].crease_weight.data[3] = 0.0;
    fVar29 = *patch->items[3].ring.items[3].crease_weight.data;
    patch->items[3].ring.items[0].crease_weight.data[1] = fVar29;
    patch->items[0].ring.items[3].crease_weight.data[2] = fVar29;
    uVar17 = patch->items[3].ring.items[3].eval_unique_identifier;
    uVar21 = patch->items[0].ring.items[0].eval_unique_identifier;
    if (uVar17 <= uVar21) {
      patch->items[3].ring.items[0].eval_start_index = 3;
      patch->items[0].ring.items[3].eval_start_index = 0;
LAB_00d6d0f0:
      patch->items[3].ring.items[0].eval_unique_identifier = uVar17;
      patch->items[0].ring.items[3].eval_unique_identifier = uVar17;
      goto LAB_00d6d0fe;
    }
    patch->items[3].ring.items[0].eval_start_index = 1;
    patch->items[0].ring.items[3].eval_start_index = 2;
  }
  patch->items[3].ring.items[0].eval_unique_identifier = uVar21;
  patch->items[0].ring.items[3].eval_unique_identifier = uVar21;
LAB_00d6d0fe:
  fVar29 = ((this->ring).items[0].vtx.field_0.m128[0] + (this->ring).items[1].vtx.field_0.m128[0] +
            (this->ring).items[2].vtx.field_0.m128[0] + (this->ring).items[3].vtx.field_0.m128[0]) *
           0.25;
  fVar34 = ((this->ring).items[0].vtx.field_0.m128[1] + (this->ring).items[1].vtx.field_0.m128[1] +
            (this->ring).items[2].vtx.field_0.m128[1] + (this->ring).items[3].vtx.field_0.m128[1]) *
           0.25;
  fVar35 = ((this->ring).items[0].vtx.field_0.m128[2] + (this->ring).items[1].vtx.field_0.m128[2] +
            (this->ring).items[2].vtx.field_0.m128[2] + (this->ring).items[3].vtx.field_0.m128[2]) *
           0.25;
  fVar36 = ((this->ring).items[0].vtx.field_0.m128[3] + (this->ring).items[1].vtx.field_0.m128[3] +
            (this->ring).items[2].vtx.field_0.m128[3] + (this->ring).items[3].vtx.field_0.m128[3]) *
           0.25;
  pVVar12 = patch->items[3].ring.items[3].ring.data;
  local_238[0] = *(long *)&pVVar12->field_0;
  local_238[1] = *(undefined8 *)((long)&pVVar12->field_0 + 8);
  local_238[0xe] = *(undefined8 *)&patch->items[3].ring.items[3].vtx.field_0;
  local_238[0xf] = *(undefined8 *)((long)&patch->items[3].ring.items[3].vtx.field_0 + 8);
  pVVar12 = patch->items[2].ring.items[2].ring.data;
  local_238[0xc] = *(undefined8 *)&pVVar12->field_0;
  local_238[0xd] = *(undefined8 *)((long)&pVVar12->field_0 + 8);
  local_238[10] = *(undefined8 *)&patch->items[2].ring.items[2].vtx.field_0;
  local_238[0xb] = *(undefined8 *)((long)&patch->items[2].ring.items[2].vtx.field_0 + 8);
  pVVar12 = patch->items[1].ring.items[1].ring.data;
  local_238[8] = *(undefined8 *)&pVVar12->field_0;
  local_238[9] = *(undefined8 *)((long)&pVVar12->field_0 + 8);
  local_238[6] = *(undefined8 *)&patch->items[1].ring.items[1].vtx.field_0;
  local_238[7] = *(undefined8 *)((long)&patch->items[1].ring.items[1].vtx.field_0 + 8);
  pVVar12 = patch->items[0].ring.items[0].ring.data;
  local_238[4] = *(undefined8 *)&pVVar12->field_0;
  local_238[5] = *(undefined8 *)((long)&pVVar12->field_0 + 8);
  local_238[2] = *(undefined8 *)&patch->items[0].ring.items[0].vtx.field_0;
  local_238[3] = *(undefined8 *)((long)&patch->items[0].ring.items[0].vtx.field_0 + 8);
  patch->items[0].ring.items[2].vertex_level = 0.0;
  patch->items[0].ring.items[2].border_index = -1;
  patch->items[0].ring.items[2].face_valence = 4;
  patch->items[0].ring.items[2].edge_valence = 8;
  patch->items[0].ring.items[2].vertex_crease_weight = 0.0;
  patch->items[0].ring.items[2].vtx.field_0.m128[0] = fVar29;
  patch->items[0].ring.items[2].vtx.field_0.m128[1] = fVar34;
  patch->items[0].ring.items[2].vtx.field_0.m128[2] = fVar35;
  patch->items[0].ring.items[2].vtx.field_0.m128[3] = fVar36;
  lVar19 = 0;
  do {
    uVar8 = *(undefined8 *)((long)local_238 + lVar19 + 8);
    puVar3 = (undefined8 *)((long)&(patch->items[0].ring.items[2].ring.data)->field_0 + lVar19);
    *puVar3 = *(undefined8 *)((long)local_238 + lVar19);
    puVar3[1] = uVar8;
    lVar19 = lVar19 + 0x10;
  } while (lVar19 != 0x80);
  lVar19 = 0;
  do {
    patch->items[0].ring.items[2].crease_weight.data[lVar19] = 0.0;
    lVar19 = lVar19 + 1;
  } while (lVar19 != 4);
  patch->items[0].ring.items[2].eval_start_index = 4;
  uVar17 = patch->items[0].ring.items[2].face_valence;
  if (uVar17 < 5) {
    patch->items[0].ring.items[2].eval_start_index = 4 - uVar17;
  }
  lVar19 = 0;
  patch->items[0].ring.items[2].eval_unique_identifier = 0;
  patch->items[1].ring.items[3].vertex_level = 0.0;
  patch->items[1].ring.items[3].border_index = -1;
  patch->items[1].ring.items[3].face_valence = 4;
  patch->items[1].ring.items[3].edge_valence = 8;
  patch->items[1].ring.items[3].vertex_crease_weight = 0.0;
  patch->items[1].ring.items[3].vtx.field_0.m128[0] = fVar29;
  patch->items[1].ring.items[3].vtx.field_0.m128[1] = fVar34;
  patch->items[1].ring.items[3].vtx.field_0.m128[2] = fVar35;
  patch->items[1].ring.items[3].vtx.field_0.m128[3] = fVar36;
  lVar10 = 2;
  do {
    uVar16 = (ulong)(((uint)lVar10 & 7) << 4);
    uVar8 = *(undefined8 *)((long)local_238 + uVar16 + 8);
    puVar3 = (undefined8 *)((long)&(patch->items[1].ring.items[3].ring.data)->field_0 + lVar19);
    *puVar3 = *(undefined8 *)((long)local_238 + uVar16);
    puVar3[1] = uVar8;
    lVar10 = lVar10 + 1;
    lVar19 = lVar19 + 0x10;
  } while (lVar10 != 10);
  lVar19 = 0;
  do {
    patch->items[1].ring.items[3].crease_weight.data[lVar19] = 0.0;
    lVar19 = lVar19 + 1;
  } while (lVar19 != 4);
  patch->items[1].ring.items[3].eval_start_index = 3;
  uVar17 = patch->items[1].ring.items[3].face_valence;
  if (uVar17 < 4) {
    patch->items[1].ring.items[3].eval_start_index = 3 - uVar17;
  }
  lVar19 = 0;
  patch->items[1].ring.items[3].eval_unique_identifier = 0;
  patch->items[2].ring.items[0].vertex_level = 0.0;
  patch->items[2].ring.items[0].border_index = -1;
  patch->items[2].ring.items[0].face_valence = 4;
  patch->items[2].ring.items[0].edge_valence = 8;
  patch->items[2].ring.items[0].vertex_crease_weight = 0.0;
  patch->items[2].ring.items[0].vtx.field_0.m128[0] = fVar29;
  patch->items[2].ring.items[0].vtx.field_0.m128[1] = fVar34;
  patch->items[2].ring.items[0].vtx.field_0.m128[2] = fVar35;
  patch->items[2].ring.items[0].vtx.field_0.m128[3] = fVar36;
  uVar16 = 0;
  do {
    uVar23 = uVar16 ^ 4;
    lVar10 = local_238[uVar23 * 2 + 1];
    uVar16 = uVar16 + 1;
    plVar4 = (long *)((long)&(patch->items[2].ring.items[0].ring.data)->field_0 + lVar19);
    *plVar4 = local_238[uVar23 * 2];
    plVar4[1] = lVar10;
    lVar19 = lVar19 + 0x10;
  } while (uVar16 != 8);
  lVar19 = 0;
  do {
    patch->items[2].ring.items[0].crease_weight.data[lVar19] = 0.0;
    lVar19 = lVar19 + 1;
  } while (lVar19 != 4);
  patch->items[2].ring.items[0].eval_start_index = 2;
  uVar17 = patch->items[2].ring.items[0].face_valence;
  if (uVar17 < 3) {
    patch->items[2].ring.items[0].eval_start_index = 2 - uVar17;
  }
  lVar19 = 0;
  patch->items[2].ring.items[0].eval_unique_identifier = 0;
  patch->items[3].ring.items[1].vertex_level = 0.0;
  patch->items[3].ring.items[1].border_index = -1;
  patch->items[3].ring.items[1].face_valence = 4;
  patch->items[3].ring.items[1].edge_valence = 8;
  patch->items[3].ring.items[1].vertex_crease_weight = 0.0;
  patch->items[3].ring.items[1].vtx.field_0.m128[0] = fVar29;
  patch->items[3].ring.items[1].vtx.field_0.m128[1] = fVar34;
  patch->items[3].ring.items[1].vtx.field_0.m128[2] = fVar35;
  patch->items[3].ring.items[1].vtx.field_0.m128[3] = fVar36;
  lVar10 = 6;
  do {
    uVar16 = (ulong)(((uint)lVar10 & 7) << 4);
    uVar8 = *(undefined8 *)((long)local_238 + uVar16 + 8);
    puVar3 = (undefined8 *)((long)&(patch->items[3].ring.items[1].ring.data)->field_0 + lVar19);
    *puVar3 = *(undefined8 *)((long)local_238 + uVar16);
    puVar3[1] = uVar8;
    lVar10 = lVar10 + 1;
    lVar19 = lVar19 + 0x10;
  } while (lVar10 != 0xe);
  lVar19 = 0;
  do {
    patch->items[3].ring.items[1].crease_weight.data[lVar19] = 0.0;
    lVar19 = lVar19 + 1;
  } while (lVar19 != 4);
  patch->items[3].ring.items[1].eval_start_index = 1;
  uVar17 = patch->items[3].ring.items[1].face_valence;
  if (uVar17 < 2) {
    patch->items[3].ring.items[1].eval_start_index = 1 - uVar17;
  }
  patch->items[3].ring.items[1].eval_unique_identifier = 0;
  return;
}

Assistant:

__noinline void subdivide(array_t<CatmullClarkPatchT,4>& patch) const
    {
      ring[0].subdivide(patch[0].ring[0]);
      ring[1].subdivide(patch[1].ring[1]);
      ring[2].subdivide(patch[2].ring[2]);
      ring[3].subdivide(patch[3].ring[3]);
      
      patch[0].ring[0].edge_level = 0.5f*ring[0].edge_level;
      patch[0].ring[1].edge_level = 0.25f*(ring[1].edge_level+ring[3].edge_level);
      patch[0].ring[2].edge_level = 0.25f*(ring[0].edge_level+ring[2].edge_level);
      patch[0].ring[3].edge_level = 0.5f*ring[3].edge_level;
      
      patch[1].ring[0].edge_level = 0.5f*ring[0].edge_level;
      patch[1].ring[1].edge_level = 0.5f*ring[1].edge_level;
      patch[1].ring[2].edge_level = 0.25f*(ring[0].edge_level+ring[2].edge_level);
      patch[1].ring[3].edge_level = 0.25f*(ring[1].edge_level+ring[3].edge_level);
      
      patch[2].ring[0].edge_level = 0.25f*(ring[0].edge_level+ring[2].edge_level);
      patch[2].ring[1].edge_level = 0.5f*ring[1].edge_level;
      patch[2].ring[2].edge_level = 0.5f*ring[2].edge_level;
      patch[2].ring[3].edge_level = 0.25f*(ring[1].edge_level+ring[3].edge_level);
      
      patch[3].ring[0].edge_level = 0.25f*(ring[0].edge_level+ring[2].edge_level);
      patch[3].ring[1].edge_level = 0.25f*(ring[1].edge_level+ring[3].edge_level);
      patch[3].ring[2].edge_level = 0.5f*ring[2].edge_level;
      patch[3].ring[3].edge_level = 0.5f*ring[3].edge_level;
      
      const bool regular0 = ring[0].has_last_face() && ring[1].face_valence > 2;
      if (likely(regular0))
        init_regular(patch[0].ring[0],patch[1].ring[1],patch[0].ring[1],patch[1].ring[0]);
      else
        init_border(patch[0].ring[0],patch[1].ring[1],patch[0].ring[1],patch[1].ring[0]);
      
      const bool regular1 = ring[1].has_last_face() && ring[2].face_valence > 2;
      if (likely(regular1))
        init_regular(patch[1].ring[1],patch[2].ring[2],patch[1].ring[2],patch[2].ring[1]);
      else
        init_border(patch[1].ring[1],patch[2].ring[2],patch[1].ring[2],patch[2].ring[1]);
      
      const bool regular2 = ring[2].has_last_face() && ring[3].face_valence > 2;
      if (likely(regular2))
        init_regular(patch[2].ring[2],patch[3].ring[3],patch[2].ring[3],patch[3].ring[2]);
      else
        init_border(patch[2].ring[2],patch[3].ring[3],patch[2].ring[3],patch[3].ring[2]);
      
      const bool regular3 = ring[3].has_last_face() && ring[0].face_valence > 2;
      if (likely(regular3))
        init_regular(patch[3].ring[3],patch[0].ring[0],patch[3].ring[0],patch[0].ring[3]);
      else
        init_border(patch[3].ring[3],patch[0].ring[0],patch[3].ring[0],patch[0].ring[3]);
      
      Vertex_t center = (ring[0].vtx + ring[1].vtx + ring[2].vtx + ring[3].vtx) * 0.25f;

      Vertex_t center_ring[8];
      center_ring[0] = (Vertex_t)patch[3].ring[3].ring[0];
      center_ring[7] = (Vertex_t)patch[3].ring[3].vtx;
      center_ring[6] = (Vertex_t)patch[2].ring[2].ring[0];
      center_ring[5] = (Vertex_t)patch[2].ring[2].vtx;
      center_ring[4] = (Vertex_t)patch[1].ring[1].ring[0];
      center_ring[3] = (Vertex_t)patch[1].ring[1].vtx;
      center_ring[2] = (Vertex_t)patch[0].ring[0].ring[0];
      center_ring[1] = (Vertex_t)patch[0].ring[0].vtx;
      
      init_regular(center,center_ring,0,patch[0].ring[2]);
      init_regular(center,center_ring,2,patch[1].ring[3]);
      init_regular(center,center_ring,4,patch[2].ring[0]);
      init_regular(center,center_ring,6,patch[3].ring[1]);
      
      assert(patch[0].verify());
      assert(patch[1].verify());
      assert(patch[2].verify());
      assert(patch[3].verify());
    }